

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [28];
  undefined1 auVar94 [28];
  undefined1 auVar95 [32];
  int iVar96;
  uint uVar97;
  ulong uVar98;
  RTCIntersectArguments *pRVar99;
  ulong uVar100;
  long lVar101;
  undefined4 uVar102;
  ulong uVar103;
  ulong uVar104;
  undefined4 uVar105;
  undefined8 unaff_R13;
  long lVar106;
  ulong uVar107;
  undefined8 uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar110 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar134;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined8 uVar155;
  float fVar168;
  undefined1 auVar156 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar167;
  float fVar169;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar195 [16];
  undefined4 uVar194;
  undefined1 auVar196 [64];
  float fVar197;
  float fVar198;
  float fVar202;
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar213;
  float fVar216;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  RTCFilterFunctionNArguments args;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_610;
  ulong local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar16 = prim[1];
  uVar103 = (ulong)(byte)PVar16;
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar134 = *(float *)(prim + uVar103 * 0x19 + 0x12);
  auVar19 = vsubps_avx(auVar19,*(undefined1 (*) [16])(prim + uVar103 * 0x19 + 6));
  auVar109._0_4_ = fVar134 * auVar19._0_4_;
  auVar109._4_4_ = fVar134 * auVar19._4_4_;
  auVar109._8_4_ = fVar134 * auVar19._8_4_;
  auVar109._12_4_ = fVar134 * auVar19._12_4_;
  auVar156._0_4_ = fVar134 * auVar20._0_4_;
  auVar156._4_4_ = fVar134 * auVar20._4_4_;
  auVar156._8_4_ = fVar134 * auVar20._8_4_;
  auVar156._12_4_ = fVar134 * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar19);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar23 = vpmovsxbd_avx2(auVar20);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar166 = vpmovsxbd_avx2(auVar10);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar121 = vpmovsxbd_avx2(auVar11);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar103 * 0xc + 6);
  auVar129 = vpmovsxbd_avx2(auVar12);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar160 = vpmovsxbd_avx2(auVar13);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar187 = vpmovsxbd_avx2(auVar14);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar103 * 0x13 + 6);
  auVar24 = vpmovsxbd_avx2(auVar179);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar103 * 0x14 + 6);
  auVar123 = vpmovsxbd_avx2(auVar15);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar203._4_4_ = auVar156._0_4_;
  auVar203._0_4_ = auVar156._0_4_;
  auVar203._8_4_ = auVar156._0_4_;
  auVar203._12_4_ = auVar156._0_4_;
  auVar203._16_4_ = auVar156._0_4_;
  auVar203._20_4_ = auVar156._0_4_;
  auVar203._24_4_ = auVar156._0_4_;
  auVar203._28_4_ = auVar156._0_4_;
  auVar19 = vmovshdup_avx(auVar156);
  uVar155 = auVar19._0_8_;
  auVar214._8_8_ = uVar155;
  auVar214._0_8_ = uVar155;
  auVar214._16_8_ = uVar155;
  auVar214._24_8_ = uVar155;
  auVar19 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar134 = auVar19._0_4_;
  auVar196._0_4_ = fVar134 * auVar166._0_4_;
  fVar133 = auVar19._4_4_;
  auVar196._4_4_ = fVar133 * auVar166._4_4_;
  auVar196._8_4_ = fVar134 * auVar166._8_4_;
  auVar196._12_4_ = fVar133 * auVar166._12_4_;
  auVar196._16_4_ = fVar134 * auVar166._16_4_;
  auVar196._20_4_ = fVar133 * auVar166._20_4_;
  auVar196._28_36_ = in_ZMM10._28_36_;
  auVar196._24_4_ = fVar134 * auVar166._24_4_;
  auVar192._0_4_ = auVar160._0_4_ * fVar134;
  auVar192._4_4_ = auVar160._4_4_ * fVar133;
  auVar192._8_4_ = auVar160._8_4_ * fVar134;
  auVar192._12_4_ = auVar160._12_4_ * fVar133;
  auVar192._16_4_ = auVar160._16_4_ * fVar134;
  auVar192._20_4_ = auVar160._20_4_ * fVar133;
  auVar192._28_36_ = in_ZMM9._28_36_;
  auVar192._24_4_ = auVar160._24_4_ * fVar134;
  auVar182._0_4_ = auVar123._0_4_ * fVar134;
  auVar182._4_4_ = auVar123._4_4_ * fVar133;
  auVar182._8_4_ = auVar123._8_4_ * fVar134;
  auVar182._12_4_ = auVar123._12_4_ * fVar133;
  auVar182._16_4_ = auVar123._16_4_ * fVar134;
  auVar182._20_4_ = auVar123._20_4_ * fVar133;
  auVar182._24_4_ = auVar123._24_4_ * fVar134;
  auVar182._28_4_ = 0;
  auVar19 = vfmadd231ps_fma(auVar196._0_32_,auVar214,auVar23);
  auVar20 = vfmadd231ps_fma(auVar192._0_32_,auVar214,auVar129);
  auVar10 = vfmadd231ps_fma(auVar182,auVar24,auVar214);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar203,auVar112);
  auVar192 = ZEXT1664(auVar11);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar203,auVar121);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar187,auVar203);
  auVar204._4_4_ = auVar109._0_4_;
  auVar204._0_4_ = auVar109._0_4_;
  auVar204._8_4_ = auVar109._0_4_;
  auVar204._12_4_ = auVar109._0_4_;
  auVar204._16_4_ = auVar109._0_4_;
  auVar204._20_4_ = auVar109._0_4_;
  auVar204._24_4_ = auVar109._0_4_;
  auVar204._28_4_ = auVar109._0_4_;
  auVar19 = vmovshdup_avx(auVar109);
  uVar155 = auVar19._0_8_;
  auVar215._8_8_ = uVar155;
  auVar215._0_8_ = uVar155;
  auVar215._16_8_ = uVar155;
  auVar215._24_8_ = uVar155;
  auVar19 = vshufps_avx(auVar109,auVar109,0xaa);
  fVar134 = auVar19._0_4_;
  auVar157._0_4_ = fVar134 * auVar166._0_4_;
  fVar133 = auVar19._4_4_;
  auVar157._4_4_ = fVar133 * auVar166._4_4_;
  auVar157._8_4_ = fVar134 * auVar166._8_4_;
  auVar157._12_4_ = fVar133 * auVar166._12_4_;
  auVar157._16_4_ = fVar134 * auVar166._16_4_;
  auVar157._20_4_ = fVar133 * auVar166._20_4_;
  auVar157._24_4_ = fVar134 * auVar166._24_4_;
  auVar157._28_4_ = 0;
  auVar21._4_4_ = auVar160._4_4_ * fVar133;
  auVar21._0_4_ = auVar160._0_4_ * fVar134;
  auVar21._8_4_ = auVar160._8_4_ * fVar134;
  auVar21._12_4_ = auVar160._12_4_ * fVar133;
  auVar21._16_4_ = auVar160._16_4_ * fVar134;
  auVar21._20_4_ = auVar160._20_4_ * fVar133;
  auVar21._24_4_ = auVar160._24_4_ * fVar134;
  auVar21._28_4_ = auVar166._28_4_;
  auVar166._4_4_ = auVar123._4_4_ * fVar133;
  auVar166._0_4_ = auVar123._0_4_ * fVar134;
  auVar166._8_4_ = auVar123._8_4_ * fVar134;
  auVar166._12_4_ = auVar123._12_4_ * fVar133;
  auVar166._16_4_ = auVar123._16_4_ * fVar134;
  auVar166._20_4_ = auVar123._20_4_ * fVar133;
  auVar166._24_4_ = auVar123._24_4_ * fVar134;
  auVar166._28_4_ = fVar133;
  auVar19 = vfmadd231ps_fma(auVar157,auVar215,auVar23);
  auVar12 = vfmadd231ps_fma(auVar21,auVar215,auVar129);
  auVar13 = vfmadd231ps_fma(auVar166,auVar215,auVar24);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar204,auVar112);
  local_400._8_4_ = 0x7fffffff;
  local_400._0_8_ = 0x7fffffff7fffffff;
  local_400._12_4_ = 0x7fffffff;
  local_400._16_4_ = 0x7fffffff;
  local_400._20_4_ = 0x7fffffff;
  local_400._24_4_ = 0x7fffffff;
  local_400._28_4_ = 0x7fffffff;
  auVar196 = ZEXT3264(local_400);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar204,auVar121);
  auVar112 = vandps_avx(ZEXT1632(auVar11),local_400);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar162._16_4_ = 0x219392ef;
  auVar162._20_4_ = 0x219392ef;
  auVar162._24_4_ = 0x219392ef;
  auVar162._28_4_ = 0x219392ef;
  auVar112 = vcmpps_avx(auVar112,auVar162,1);
  auVar23 = vblendvps_avx(ZEXT1632(auVar11),auVar162,auVar112);
  auVar112 = vandps_avx(ZEXT1632(auVar20),local_400);
  auVar112 = vcmpps_avx(auVar112,auVar162,1);
  auVar166 = vblendvps_avx(ZEXT1632(auVar20),auVar162,auVar112);
  auVar112 = vandps_avx(local_400,ZEXT1632(auVar10));
  auVar112 = vcmpps_avx(auVar112,auVar162,1);
  auVar121 = vrcpps_avx(auVar23);
  auVar112 = vblendvps_avx(ZEXT1632(auVar10),auVar162,auVar112);
  auVar131._8_4_ = 0x3f800000;
  auVar131._0_8_ = 0x3f8000003f800000;
  auVar131._12_4_ = 0x3f800000;
  auVar131._16_4_ = 0x3f800000;
  auVar131._20_4_ = 0x3f800000;
  auVar131._24_4_ = 0x3f800000;
  auVar131._28_4_ = 0x3f800000;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar204,auVar187);
  auVar129 = vrcpps_avx(auVar166);
  auVar19 = vfnmadd213ps_fma(auVar23,auVar121,auVar131);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar121,auVar121);
  auVar20 = vfnmadd213ps_fma(auVar166,auVar129,auVar131);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar129,auVar129);
  auVar23 = vrcpps_avx(auVar112);
  auVar10 = vfnmadd213ps_fma(auVar112,auVar23,auVar131);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar23,auVar23);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar14));
  auVar121._4_4_ = auVar19._4_4_ * auVar112._4_4_;
  auVar121._0_4_ = auVar19._0_4_ * auVar112._0_4_;
  auVar121._8_4_ = auVar19._8_4_ * auVar112._8_4_;
  auVar121._12_4_ = auVar19._12_4_ * auVar112._12_4_;
  auVar121._16_4_ = auVar112._16_4_ * 0.0;
  auVar121._20_4_ = auVar112._20_4_ * 0.0;
  auVar121._24_4_ = auVar112._24_4_ * 0.0;
  auVar121._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar14));
  auVar129._4_4_ = auVar19._4_4_ * auVar112._4_4_;
  auVar129._0_4_ = auVar19._0_4_ * auVar112._0_4_;
  auVar129._8_4_ = auVar19._8_4_ * auVar112._8_4_;
  auVar129._12_4_ = auVar19._12_4_ * auVar112._12_4_;
  auVar129._16_4_ = auVar112._16_4_ * 0.0;
  auVar129._20_4_ = auVar112._20_4_ * 0.0;
  auVar129._24_4_ = auVar112._24_4_ * 0.0;
  auVar129._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0xe + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar12));
  auVar160._4_4_ = auVar20._4_4_ * auVar112._4_4_;
  auVar160._0_4_ = auVar20._0_4_ * auVar112._0_4_;
  auVar160._8_4_ = auVar20._8_4_ * auVar112._8_4_;
  auVar160._12_4_ = auVar20._12_4_ * auVar112._12_4_;
  auVar160._16_4_ = auVar112._16_4_ * 0.0;
  auVar160._20_4_ = auVar112._20_4_ * 0.0;
  auVar160._24_4_ = auVar112._24_4_ * 0.0;
  auVar160._28_4_ = auVar112._28_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar16;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar16 * 0x10 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar12));
  auVar187._4_4_ = auVar20._4_4_ * auVar112._4_4_;
  auVar187._0_4_ = auVar20._0_4_ * auVar112._0_4_;
  auVar187._8_4_ = auVar20._8_4_ * auVar112._8_4_;
  auVar187._12_4_ = auVar20._12_4_ * auVar112._12_4_;
  auVar187._16_4_ = auVar112._16_4_ * 0.0;
  auVar187._20_4_ = auVar112._20_4_ * 0.0;
  auVar187._24_4_ = auVar112._24_4_ * 0.0;
  auVar187._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x15 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar11));
  auVar24._4_4_ = auVar112._4_4_ * auVar10._4_4_;
  auVar24._0_4_ = auVar112._0_4_ * auVar10._0_4_;
  auVar24._8_4_ = auVar112._8_4_ * auVar10._8_4_;
  auVar24._12_4_ = auVar112._12_4_ * auVar10._12_4_;
  auVar24._16_4_ = auVar112._16_4_ * 0.0;
  auVar24._20_4_ = auVar112._20_4_ * 0.0;
  auVar24._24_4_ = auVar112._24_4_ * 0.0;
  auVar24._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar11));
  auVar123._4_4_ = auVar10._4_4_ * auVar112._4_4_;
  auVar123._0_4_ = auVar10._0_4_ * auVar112._0_4_;
  auVar123._8_4_ = auVar10._8_4_ * auVar112._8_4_;
  auVar123._12_4_ = auVar10._12_4_ * auVar112._12_4_;
  auVar123._16_4_ = auVar112._16_4_ * 0.0;
  auVar123._20_4_ = auVar112._20_4_ * 0.0;
  auVar123._24_4_ = auVar112._24_4_ * 0.0;
  auVar123._28_4_ = auVar112._28_4_;
  auVar112 = vpminsd_avx2(auVar121,auVar129);
  auVar23 = vpminsd_avx2(auVar160,auVar187);
  auVar112 = vmaxps_avx(auVar112,auVar23);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar183._4_4_ = uVar105;
  auVar183._0_4_ = uVar105;
  auVar183._8_4_ = uVar105;
  auVar183._12_4_ = uVar105;
  auVar183._16_4_ = uVar105;
  auVar183._20_4_ = uVar105;
  auVar183._24_4_ = uVar105;
  auVar183._28_4_ = uVar105;
  auVar23 = vpminsd_avx2(auVar24,auVar123);
  auVar23 = vmaxps_avx(auVar23,auVar183);
  auVar112 = vmaxps_avx(auVar112,auVar23);
  local_80._4_4_ = auVar112._4_4_ * 0.99999964;
  local_80._0_4_ = auVar112._0_4_ * 0.99999964;
  local_80._8_4_ = auVar112._8_4_ * 0.99999964;
  local_80._12_4_ = auVar112._12_4_ * 0.99999964;
  local_80._16_4_ = auVar112._16_4_ * 0.99999964;
  local_80._20_4_ = auVar112._20_4_ * 0.99999964;
  local_80._24_4_ = auVar112._24_4_ * 0.99999964;
  local_80._28_4_ = auVar23._28_4_;
  auVar112 = vpmaxsd_avx2(auVar121,auVar129);
  auVar23 = vpmaxsd_avx2(auVar160,auVar187);
  auVar112 = vminps_avx(auVar112,auVar23);
  auVar23 = vpmaxsd_avx2(auVar24,auVar123);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar139._4_4_ = uVar105;
  auVar139._0_4_ = uVar105;
  auVar139._8_4_ = uVar105;
  auVar139._12_4_ = uVar105;
  auVar139._16_4_ = uVar105;
  auVar139._20_4_ = uVar105;
  auVar139._24_4_ = uVar105;
  auVar139._28_4_ = uVar105;
  auVar23 = vminps_avx(auVar23,auVar139);
  auVar112 = vminps_avx(auVar112,auVar23);
  auVar22._4_4_ = auVar112._4_4_ * 1.0000004;
  auVar22._0_4_ = auVar112._0_4_ * 1.0000004;
  auVar22._8_4_ = auVar112._8_4_ * 1.0000004;
  auVar22._12_4_ = auVar112._12_4_ * 1.0000004;
  auVar22._16_4_ = auVar112._16_4_ * 1.0000004;
  auVar22._20_4_ = auVar112._20_4_ * 1.0000004;
  auVar22._24_4_ = auVar112._24_4_ * 1.0000004;
  auVar22._28_4_ = auVar112._28_4_;
  auVar114[4] = PVar16;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar16;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar16;
  auVar114._13_3_ = 0;
  auVar114[0x10] = PVar16;
  auVar114._17_3_ = 0;
  auVar114[0x14] = PVar16;
  auVar114._21_3_ = 0;
  auVar114[0x18] = PVar16;
  auVar114._25_3_ = 0;
  auVar114[0x1c] = PVar16;
  auVar114._29_3_ = 0;
  auVar23 = vpcmpgtd_avx2(auVar114,_DAT_01fb4ba0);
  auVar112 = vcmpps_avx(local_80,auVar22,2);
  auVar112 = vandps_avx(auVar112,auVar23);
  uVar105 = vmovmskps_avx(auVar112);
  local_608 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar105);
  local_610 = pre->ray_space + k;
  local_600 = mm_lookupmask_ps._16_8_;
  uStack_5f8 = mm_lookupmask_ps._24_8_;
  uStack_5f0 = mm_lookupmask_ps._16_8_;
  uStack_5e8 = mm_lookupmask_ps._24_8_;
  iVar96 = 1 << ((uint)k & 0x1f);
  auVar112._4_4_ = iVar96;
  auVar112._0_4_ = iVar96;
  auVar112._8_4_ = iVar96;
  auVar112._12_4_ = iVar96;
  auVar112._16_4_ = iVar96;
  auVar112._20_4_ = iVar96;
  auVar112._24_4_ = iVar96;
  auVar112._28_4_ = iVar96;
  auVar23 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar112 = vpand_avx2(auVar112,auVar23);
  local_420 = vpcmpeqd_avx2(auVar112,auVar23);
  while (local_608 != 0) {
    local_680 = auVar192._0_32_;
    lVar106 = 0;
    for (uVar103 = local_608; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      lVar106 = lVar106 + 1;
    }
    uVar97 = *(uint *)(prim + 2);
    local_660._4_4_ = *(undefined4 *)(prim + lVar106 * 4 + 6);
    pGVar17 = (context->scene->geometries).items[uVar97].ptr;
    uVar103 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                              pGVar17[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)(uint)local_660._4_4_
                              );
    p_Var18 = pGVar17[1].intersectionFilterN;
    lVar106 = *(long *)&pGVar17[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar106 + (long)p_Var18 * uVar103);
    uVar155 = *(undefined8 *)*pauVar1;
    uVar87 = *(undefined8 *)(*pauVar1 + 8);
    auVar13 = *pauVar1;
    auVar10 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar106 + (uVar103 + 1) * (long)p_Var18);
    uVar88 = *(undefined8 *)*pauVar2;
    uVar89 = *(undefined8 *)(*pauVar2 + 8);
    auVar12 = *pauVar2;
    auVar20 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar106 + (uVar103 + 2) * (long)p_Var18);
    uVar90 = *(undefined8 *)*pauVar3;
    uVar91 = *(undefined8 *)(*pauVar3 + 8);
    auVar11 = *pauVar3;
    auVar19 = *pauVar3;
    uVar107 = local_608 - 1 & local_608;
    pauVar4 = (undefined1 (*) [12])(lVar106 + (uVar103 + 3) * (long)p_Var18);
    local_6b0 = (float)*(undefined8 *)*pauVar4;
    fStack_6ac = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_6a8 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_6a4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    uVar103 = uVar107 - 1;
    if (uVar107 != 0) {
      uVar103 = uVar103 & uVar107;
      for (uVar98 = uVar107; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
      uVar98 = uVar103;
      if (uVar103 != 0) {
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar109 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    iVar96 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar179 = vsubps_avx(*pauVar1,auVar109);
    uVar105 = auVar179._0_4_;
    auVar146._4_4_ = uVar105;
    auVar146._0_4_ = uVar105;
    auVar146._8_4_ = uVar105;
    auVar146._12_4_ = uVar105;
    auVar14 = vshufps_avx(auVar179,auVar179,0x55);
    auVar179 = vshufps_avx(auVar179,auVar179,0xaa);
    aVar8 = (local_610->vx).field_0;
    aVar9 = (local_610->vy).field_0;
    fVar134 = (local_610->vz).field_0.m128[0];
    fVar133 = *(float *)((long)&(local_610->vz).field_0 + 4);
    fVar167 = *(float *)((long)&(local_610->vz).field_0 + 8);
    fVar168 = *(float *)((long)&(local_610->vz).field_0 + 0xc);
    auVar173._0_4_ = fVar134 * auVar179._0_4_;
    auVar173._4_4_ = fVar133 * auVar179._4_4_;
    auVar173._8_4_ = fVar167 * auVar179._8_4_;
    auVar173._12_4_ = fVar168 * auVar179._12_4_;
    auVar14 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar9,auVar14);
    auVar146 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar8,auVar146);
    auVar14 = vblendps_avx(auVar146,*pauVar1,8);
    auVar15 = vsubps_avx(*pauVar2,auVar109);
    uVar105 = auVar15._0_4_;
    auVar174._4_4_ = uVar105;
    auVar174._0_4_ = uVar105;
    auVar174._8_4_ = uVar105;
    auVar174._12_4_ = uVar105;
    auVar179 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar189._0_4_ = fVar134 * auVar15._0_4_;
    auVar189._4_4_ = fVar133 * auVar15._4_4_;
    auVar189._8_4_ = fVar167 * auVar15._8_4_;
    auVar189._12_4_ = fVar168 * auVar15._12_4_;
    auVar179 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar9,auVar179);
    auVar173 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar8,auVar174);
    auVar179 = vblendps_avx(auVar173,*pauVar2,8);
    auVar156 = vsubps_avx(*pauVar3,auVar109);
    uVar105 = auVar156._0_4_;
    auVar180._4_4_ = uVar105;
    auVar180._0_4_ = uVar105;
    auVar180._8_4_ = uVar105;
    auVar180._12_4_ = uVar105;
    auVar15 = vshufps_avx(auVar156,auVar156,0x55);
    auVar156 = vshufps_avx(auVar156,auVar156,0xaa);
    auVar195._0_4_ = fVar134 * auVar156._0_4_;
    auVar195._4_4_ = fVar133 * auVar156._4_4_;
    auVar195._8_4_ = fVar167 * auVar156._8_4_;
    auVar195._12_4_ = fVar168 * auVar156._12_4_;
    auVar15 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar9,auVar15);
    auVar174 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar8,auVar180);
    auVar15 = vblendps_avx(auVar174,*pauVar3,8);
    auVar26._12_4_ = fStack_6a4;
    auVar26._0_12_ = *pauVar4;
    auVar156 = vsubps_avx(auVar26,auVar109);
    uVar105 = auVar156._0_4_;
    auVar181._4_4_ = uVar105;
    auVar181._0_4_ = uVar105;
    auVar181._8_4_ = uVar105;
    auVar181._12_4_ = uVar105;
    auVar109 = vshufps_avx(auVar156,auVar156,0x55);
    auVar156 = vshufps_avx(auVar156,auVar156,0xaa);
    auVar199._0_4_ = fVar134 * auVar156._0_4_;
    auVar199._4_4_ = fVar133 * auVar156._4_4_;
    auVar199._8_4_ = fVar167 * auVar156._8_4_;
    auVar199._12_4_ = fVar168 * auVar156._12_4_;
    auVar109 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar9,auVar109);
    auVar180 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar8,auVar181);
    auVar109 = vblendps_avx(auVar180,auVar26,8);
    auVar124._8_4_ = 0x7fffffff;
    auVar124._0_8_ = 0x7fffffff7fffffff;
    auVar124._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx(auVar14,auVar124);
    auVar179 = vandps_avx(auVar179,auVar124);
    auVar156 = vmaxps_avx(auVar14,auVar179);
    auVar14 = vandps_avx(auVar15,auVar124);
    auVar179 = vandps_avx(auVar109,auVar124);
    auVar14 = vmaxps_avx(auVar14,auVar179);
    auVar14 = vmaxps_avx(auVar156,auVar14);
    auVar179 = vmovshdup_avx(auVar14);
    auVar179 = vmaxss_avx(auVar179,auVar14);
    auVar14 = vshufpd_avx(auVar14,auVar14,1);
    auVar14 = vmaxss_avx(auVar14,auVar179);
    lVar106 = (long)iVar96 * 0x44;
    auVar179 = vmovshdup_avx(auVar146);
    uVar108 = auVar179._0_8_;
    local_5e0._8_8_ = uVar108;
    local_5e0._0_8_ = uVar108;
    local_5e0._16_8_ = uVar108;
    local_5e0._24_8_ = uVar108;
    auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 + 0x484);
    auVar179 = vmovshdup_avx(auVar173);
    uVar108 = auVar179._0_8_;
    local_520._8_8_ = uVar108;
    local_520._0_8_ = uVar108;
    local_520._16_8_ = uVar108;
    local_520._24_8_ = uVar108;
    auVar23 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 + 0x908);
    uVar194 = auVar174._0_4_;
    auVar140._4_4_ = uVar194;
    auVar140._0_4_ = uVar194;
    auVar140._8_4_ = uVar194;
    auVar140._12_4_ = uVar194;
    auVar140._16_4_ = uVar194;
    auVar140._20_4_ = uVar194;
    auVar140._24_4_ = uVar194;
    auVar140._28_4_ = uVar194;
    auVar179 = vmovshdup_avx(auVar174);
    uVar108 = auVar179._0_8_;
    auVar158._8_8_ = uVar108;
    auVar158._0_8_ = uVar108;
    auVar158._16_8_ = uVar108;
    auVar158._24_8_ = uVar108;
    fVar133 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar106 + 0xd8c);
    fVar167 = *(float *)(catmullrom_basis0 + lVar106 + 0xd90);
    fVar168 = *(float *)(catmullrom_basis0 + lVar106 + 0xd94);
    fVar169 = *(float *)(catmullrom_basis0 + lVar106 + 0xd98);
    fVar170 = *(float *)(catmullrom_basis0 + lVar106 + 0xd9c);
    fVar171 = *(float *)(catmullrom_basis0 + lVar106 + 0xda0);
    fVar172 = *(float *)(catmullrom_basis0 + lVar106 + 0xda4);
    auVar93 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar106 + 0xd8c);
    fVar197 = auVar180._0_4_;
    auVar179 = vmovshdup_avx(auVar180);
    auVar175._0_4_ = fVar133 * fVar197;
    auVar175._4_4_ = fVar167 * fVar197;
    auVar175._8_4_ = fVar168 * fVar197;
    auVar175._12_4_ = fVar169 * fVar197;
    auVar175._16_4_ = fVar170 * fVar197;
    auVar175._20_4_ = fVar171 * fVar197;
    auVar175._24_4_ = fVar172 * fVar197;
    auVar175._28_4_ = 0;
    fVar213 = auVar179._0_4_;
    auVar113._0_4_ = fVar213 * fVar133;
    fVar216 = auVar179._4_4_;
    auVar113._4_4_ = fVar216 * fVar167;
    auVar113._8_4_ = fVar213 * fVar168;
    auVar113._12_4_ = fVar216 * fVar169;
    auVar113._16_4_ = fVar213 * fVar170;
    auVar113._20_4_ = fVar216 * fVar171;
    auVar113._24_4_ = fVar213 * fVar172;
    auVar113._28_4_ = 0;
    auVar179 = vfmadd231ps_fma(auVar175,auVar23,auVar140);
    auVar15 = vfmadd231ps_fma(auVar113,auVar23,auVar158);
    uVar105 = auVar173._0_4_;
    auVar205._4_4_ = uVar105;
    auVar205._0_4_ = uVar105;
    auVar205._8_4_ = uVar105;
    auVar205._12_4_ = uVar105;
    auVar205._16_4_ = uVar105;
    auVar205._20_4_ = uVar105;
    auVar205._24_4_ = uVar105;
    auVar205._28_4_ = uVar105;
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar112,auVar205);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_520);
    auVar166 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106);
    uVar105 = auVar146._0_4_;
    auVar153._4_4_ = uVar105;
    auVar153._0_4_ = uVar105;
    auVar153._8_4_ = uVar105;
    auVar153._12_4_ = uVar105;
    auVar153._16_4_ = uVar105;
    auVar153._20_4_ = uVar105;
    auVar153._24_4_ = uVar105;
    auVar153._28_4_ = uVar105;
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar166,auVar153);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar166,local_5e0);
    auVar121 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 + 0x908);
    local_4a0 = *(float *)(catmullrom_basis1 + lVar106 + 0xd8c);
    fStack_49c = *(float *)(catmullrom_basis1 + lVar106 + 0xd90);
    fStack_498 = *(float *)(catmullrom_basis1 + lVar106 + 0xd94);
    fStack_494 = *(float *)(catmullrom_basis1 + lVar106 + 0xd98);
    fStack_490 = *(float *)(catmullrom_basis1 + lVar106 + 0xd9c);
    fStack_48c = *(float *)(catmullrom_basis1 + lVar106 + 0xda0);
    fStack_488 = *(float *)(catmullrom_basis1 + lVar106 + 0xda4);
    fStack_484 = *(float *)(catmullrom_basis1 + lVar106 + 0xda8);
    auVar27._4_4_ = fStack_49c * fVar197;
    auVar27._0_4_ = local_4a0 * fVar197;
    auVar27._8_4_ = fStack_498 * fVar197;
    auVar27._12_4_ = fStack_494 * fVar197;
    auVar27._16_4_ = fStack_490 * fVar197;
    auVar27._20_4_ = fStack_48c * fVar197;
    auVar27._24_4_ = fStack_488 * fVar197;
    auVar27._28_4_ = fVar197;
    auVar109 = vfmadd231ps_fma(auVar27,auVar121,auVar140);
    auVar28._4_4_ = fVar216 * fStack_49c;
    auVar28._0_4_ = fVar213 * local_4a0;
    auVar28._8_4_ = fVar213 * fStack_498;
    auVar28._12_4_ = fVar216 * fStack_494;
    auVar28._16_4_ = fVar213 * fStack_490;
    auVar28._20_4_ = fVar216 * fStack_48c;
    auVar28._24_4_ = fVar213 * fStack_488;
    auVar28._28_4_ = uVar194;
    auVar156 = vfmadd231ps_fma(auVar28,auVar121,auVar158);
    auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 + 0x484);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar129,auVar205);
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar129,local_520);
    auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar160,auVar153);
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar160,local_5e0);
    local_440 = ZEXT1632(auVar109);
    local_480 = ZEXT1632(auVar179);
    auVar123 = vsubps_avx(local_440,local_480);
    local_460 = ZEXT1632(auVar156);
    auVar114 = ZEXT1632(auVar15);
    auVar21 = vsubps_avx(local_460,auVar114);
    auVar115._0_4_ = auVar15._0_4_ * auVar123._0_4_;
    auVar115._4_4_ = auVar15._4_4_ * auVar123._4_4_;
    auVar115._8_4_ = auVar15._8_4_ * auVar123._8_4_;
    auVar115._12_4_ = auVar15._12_4_ * auVar123._12_4_;
    auVar115._16_4_ = auVar123._16_4_ * 0.0;
    auVar115._20_4_ = auVar123._20_4_ * 0.0;
    auVar115._24_4_ = auVar123._24_4_ * 0.0;
    auVar115._28_4_ = 0;
    fVar198 = auVar21._0_4_;
    auVar125._0_4_ = fVar198 * auVar179._0_4_;
    fVar202 = auVar21._4_4_;
    auVar125._4_4_ = fVar202 * auVar179._4_4_;
    fVar208 = auVar21._8_4_;
    auVar125._8_4_ = fVar208 * auVar179._8_4_;
    fVar209 = auVar21._12_4_;
    auVar125._12_4_ = fVar209 * auVar179._12_4_;
    fVar210 = auVar21._16_4_;
    auVar125._16_4_ = fVar210 * 0.0;
    fVar211 = auVar21._20_4_;
    auVar125._20_4_ = fVar211 * 0.0;
    fVar212 = auVar21._24_4_;
    auVar125._24_4_ = fVar212 * 0.0;
    auVar125._28_4_ = 0;
    auVar24 = vsubps_avx(auVar115,auVar125);
    auVar179 = vpermilps_avx(*pauVar1,0xff);
    uVar108 = auVar179._0_8_;
    local_a0._8_8_ = uVar108;
    local_a0._0_8_ = uVar108;
    local_a0._16_8_ = uVar108;
    local_a0._24_8_ = uVar108;
    auVar15 = vpermilps_avx(*pauVar2,0xff);
    uVar108 = auVar15._0_8_;
    local_c0._8_8_ = uVar108;
    local_c0._0_8_ = uVar108;
    local_c0._16_8_ = uVar108;
    local_c0._24_8_ = uVar108;
    auVar15 = vpermilps_avx(*pauVar3,0xff);
    uVar108 = auVar15._0_8_;
    local_e0._8_8_ = uVar108;
    local_e0._0_8_ = uVar108;
    local_e0._16_8_ = uVar108;
    local_e0._24_8_ = uVar108;
    auVar25._12_4_ = fStack_6a4;
    auVar25._0_12_ = *pauVar4;
    auVar15 = vpermilps_avx(auVar25,0xff);
    local_100 = auVar15._0_8_;
    fVar134 = auVar15._0_4_;
    auVar176._0_4_ = fVar133 * fVar134;
    fVar133 = auVar15._4_4_;
    auVar176._4_4_ = fVar167 * fVar133;
    auVar176._8_4_ = fVar168 * fVar134;
    auVar176._12_4_ = fVar169 * fVar133;
    auVar176._16_4_ = fVar170 * fVar134;
    auVar176._20_4_ = fVar171 * fVar133;
    auVar176._24_4_ = fVar172 * fVar134;
    auVar176._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar176,local_e0,auVar23);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_c0,auVar112);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar166,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar29._4_4_ = fStack_49c * fVar133;
    auVar29._0_4_ = local_4a0 * fVar134;
    auVar29._8_4_ = fStack_498 * fVar134;
    auVar29._12_4_ = fStack_494 * fVar133;
    auVar29._16_4_ = fStack_490 * fVar134;
    auVar29._20_4_ = fStack_48c * fVar133;
    auVar29._24_4_ = fStack_488 * fVar134;
    auVar29._28_4_ = auVar166._28_4_;
    auVar15 = vfmadd231ps_fma(auVar29,auVar121,local_e0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar129,local_c0);
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar160,local_a0);
    auVar30._4_4_ = fVar202 * fVar202;
    auVar30._0_4_ = fVar198 * fVar198;
    auVar30._8_4_ = fVar208 * fVar208;
    auVar30._12_4_ = fVar209 * fVar209;
    auVar30._16_4_ = fVar210 * fVar210;
    auVar30._20_4_ = fVar211 * fVar211;
    auVar30._24_4_ = fVar212 * fVar212;
    auVar30._28_4_ = auVar179._4_4_;
    auVar179 = vfmadd231ps_fma(auVar30,auVar123,auVar123);
    auVar187 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar156));
    auVar31._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar179._4_4_;
    auVar31._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar179._0_4_;
    auVar31._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar179._8_4_;
    auVar31._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar179._12_4_;
    auVar31._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
    auVar31._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
    auVar31._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
    auVar31._28_4_ = auVar187._28_4_;
    auVar32._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar32._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar32._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar32._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar32._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar32._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar32._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar32._28_4_ = auVar24._28_4_;
    auVar187 = vcmpps_avx(auVar32,auVar31,2);
    fVar134 = auVar14._0_4_ * 4.7683716e-07;
    auVar116._0_4_ = (float)iVar96;
    register0x000014c4 = auVar174._4_12_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar24 = vcmpps_avx(_DAT_01f7b060,auVar116,1);
    auVar179 = vpermilps_avx(auVar146,0xaa);
    uVar108 = auVar179._0_8_;
    local_5c0._8_8_ = uVar108;
    local_5c0._0_8_ = uVar108;
    local_5c0._16_8_ = uVar108;
    local_5c0._24_8_ = uVar108;
    auVar15 = vpermilps_avx(auVar173,0xaa);
    uVar108 = auVar15._0_8_;
    local_5a0._8_8_ = uVar108;
    local_5a0._0_8_ = uVar108;
    local_5a0._16_8_ = uVar108;
    local_5a0._24_8_ = uVar108;
    auVar14 = vshufps_avx(auVar174,auVar174,0xaa);
    uVar108 = auVar14._0_8_;
    local_3a0._8_8_ = uVar108;
    local_3a0._0_8_ = uVar108;
    local_3a0._16_8_ = uVar108;
    local_3a0._24_8_ = uVar108;
    auVar14 = vshufps_avx(auVar180,auVar180,0xaa);
    uVar108 = auVar14._0_8_;
    register0x00001508 = uVar108;
    local_6a0 = uVar108;
    register0x00001510 = uVar108;
    register0x00001518 = uVar108;
    auVar22 = auVar24 & auVar187;
    uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_560 = ZEXT416((uint)local_660._4_4_);
    local_540._0_4_ = auVar116._0_4_;
    local_560._0_4_ = local_660._4_4_;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0x7f,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar22 >> 0xbf,0) == '\0') &&
        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f]) {
LAB_013551d8:
      auVar201 = ZEXT3264(_local_6a0);
      uVar103 = 0;
    }
    else {
      local_4c0 = vandps_avx(auVar187,auVar24);
      fVar198 = auVar14._0_4_;
      fVar202 = auVar14._4_4_;
      auVar33._4_4_ = fVar202 * fStack_49c;
      auVar33._0_4_ = fVar198 * local_4a0;
      auVar33._8_4_ = fVar198 * fStack_498;
      auVar33._12_4_ = fVar202 * fStack_494;
      auVar33._16_4_ = fVar198 * fStack_490;
      auVar33._20_4_ = fVar202 * fStack_48c;
      auVar33._24_4_ = fVar198 * fStack_488;
      auVar33._28_4_ = local_4c0._28_4_;
      auVar14 = vfmadd213ps_fma(auVar121,local_3a0,auVar33);
      auVar14 = vfmadd213ps_fma(auVar129,local_5a0,ZEXT1632(auVar14));
      auVar14 = vfmadd213ps_fma(auVar160,local_5c0,ZEXT1632(auVar14));
      local_580._0_4_ = auVar93._0_4_;
      local_580._4_4_ = auVar93._4_4_;
      fStack_578 = auVar93._8_4_;
      fStack_574 = auVar93._12_4_;
      fStack_570 = auVar93._16_4_;
      fStack_56c = auVar93._20_4_;
      fStack_568 = auVar93._24_4_;
      auVar117._0_4_ = fVar198 * (float)local_580._0_4_;
      auVar117._4_4_ = fVar202 * (float)local_580._4_4_;
      auVar117._8_4_ = fVar198 * fStack_578;
      auVar117._12_4_ = fVar202 * fStack_574;
      auVar117._16_4_ = fVar198 * fStack_570;
      auVar117._20_4_ = fVar202 * fStack_56c;
      auVar117._24_4_ = fVar198 * fStack_568;
      auVar117._28_4_ = 0;
      auVar146 = vfmadd213ps_fma(auVar23,local_3a0,auVar117);
      auVar146 = vfmadd213ps_fma(auVar112,local_5a0,ZEXT1632(auVar146));
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 + 0x1210);
      auVar23 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 + 0x1694);
      auVar121 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 + 0x1b18);
      fVar133 = *(float *)(catmullrom_basis0 + lVar106 + 0x1f9c);
      fVar167 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fa0);
      fVar168 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fa4);
      fVar169 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fa8);
      fVar170 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fac);
      fVar171 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fb0);
      fVar172 = *(float *)(catmullrom_basis0 + lVar106 + 0x1fb4);
      auVar159._0_4_ = fVar133 * fVar197;
      auVar159._4_4_ = fVar167 * fVar197;
      auVar159._8_4_ = fVar168 * fVar197;
      auVar159._12_4_ = fVar169 * fVar197;
      auVar159._16_4_ = fVar170 * fVar197;
      auVar159._20_4_ = fVar171 * fVar197;
      auVar159._24_4_ = fVar172 * fVar197;
      auVar159._28_4_ = 0;
      auVar34._4_4_ = fVar216 * fVar167;
      auVar34._0_4_ = fVar213 * fVar133;
      auVar34._8_4_ = fVar213 * fVar168;
      auVar34._12_4_ = fVar216 * fVar169;
      auVar34._16_4_ = fVar213 * fVar170;
      auVar34._20_4_ = fVar216 * fVar171;
      auVar34._24_4_ = fVar213 * fVar172;
      auVar34._28_4_ = auVar15._4_4_;
      auVar190._0_4_ = fVar198 * fVar133;
      auVar190._4_4_ = fVar202 * fVar167;
      auVar190._8_4_ = fVar198 * fVar168;
      auVar190._12_4_ = fVar202 * fVar169;
      auVar190._16_4_ = fVar198 * fVar170;
      auVar190._20_4_ = fVar202 * fVar171;
      auVar190._24_4_ = fVar198 * fVar172;
      auVar190._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar159,auVar121,auVar140);
      auVar173 = vfmadd231ps_fma(auVar34,auVar121,auVar158);
      auVar174 = vfmadd231ps_fma(auVar190,local_3a0,auVar121);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar23,auVar205);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar23,local_520);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar23,local_5a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,auVar153);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar112,local_5e0);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),local_5c0,auVar112);
      fVar133 = *(float *)(catmullrom_basis1 + lVar106 + 0x1f9c);
      fVar167 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fa0);
      fVar168 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fa4);
      fVar169 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fa8);
      fVar170 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fac);
      fVar171 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fb0);
      fVar172 = *(float *)(catmullrom_basis1 + lVar106 + 0x1fb4);
      auVar23._4_4_ = fVar167 * fVar197;
      auVar23._0_4_ = fVar133 * fVar197;
      auVar23._8_4_ = fVar168 * fVar197;
      auVar23._12_4_ = fVar169 * fVar197;
      auVar23._16_4_ = fVar170 * fVar197;
      auVar23._20_4_ = fVar171 * fVar197;
      auVar23._24_4_ = fVar172 * fVar197;
      auVar23._28_4_ = auVar112._28_4_;
      auVar35._4_4_ = fVar216 * fVar167;
      auVar35._0_4_ = fVar213 * fVar133;
      auVar35._8_4_ = fVar213 * fVar168;
      auVar35._12_4_ = fVar216 * fVar169;
      auVar35._16_4_ = fVar213 * fVar170;
      auVar35._20_4_ = fVar216 * fVar171;
      auVar35._24_4_ = fVar213 * fVar172;
      auVar35._28_4_ = fVar202;
      auVar36._4_4_ = fVar202 * fVar167;
      auVar36._0_4_ = fVar198 * fVar133;
      auVar36._8_4_ = fVar198 * fVar168;
      auVar36._12_4_ = fVar202 * fVar169;
      auVar36._16_4_ = fVar198 * fVar170;
      auVar36._20_4_ = fVar202 * fVar171;
      auVar36._24_4_ = fVar198 * fVar172;
      auVar36._28_4_ = auVar179._4_4_;
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 + 0x1b18);
      auVar179 = vfmadd231ps_fma(auVar23,auVar112,auVar140);
      auVar180 = vfmadd231ps_fma(auVar35,auVar112,auVar158);
      auVar26 = vfmadd231ps_fma(auVar36,auVar112,local_3a0);
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 + 0x1694);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar112,auVar205);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar112,local_520);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar112,local_5a0);
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 + 0x1210);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar112,auVar153);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar112,local_5e0);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_5c0,auVar112);
      auVar112 = vandps_avx(local_400,ZEXT1632(auVar15));
      auVar23 = vandps_avx(ZEXT1632(auVar173),local_400);
      auVar23 = vmaxps_avx(auVar112,auVar23);
      auVar112 = vandps_avx(ZEXT1632(auVar174),local_400);
      auVar112 = vmaxps_avx(auVar23,auVar112);
      auVar126._4_4_ = fVar134;
      auVar126._0_4_ = fVar134;
      auVar126._8_4_ = fVar134;
      auVar126._12_4_ = fVar134;
      auVar126._16_4_ = fVar134;
      auVar126._20_4_ = fVar134;
      auVar126._24_4_ = fVar134;
      auVar126._28_4_ = fVar134;
      auVar112 = vcmpps_avx(auVar112,auVar126,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar15),auVar123,auVar112);
      auVar129 = vblendvps_avx(ZEXT1632(auVar173),auVar21,auVar112);
      auVar112 = vandps_avx(ZEXT1632(auVar179),local_400);
      auVar23 = vandps_avx(ZEXT1632(auVar180),local_400);
      auVar23 = vmaxps_avx(auVar112,auVar23);
      auVar112 = vandps_avx(ZEXT1632(auVar26),local_400);
      auVar112 = vmaxps_avx(auVar23,auVar112);
      auVar23 = vcmpps_avx(auVar112,auVar126,1);
      auVar112 = vblendvps_avx(ZEXT1632(auVar179),auVar123,auVar23);
      auVar23 = vblendvps_avx(ZEXT1632(auVar180),auVar21,auVar23);
      auVar179 = vfmadd213ps_fma(auVar166,local_5c0,ZEXT1632(auVar146));
      auVar15 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar129,auVar129);
      auVar166 = vrsqrtps_avx(ZEXT1632(auVar15));
      fVar133 = auVar166._0_4_;
      fVar167 = auVar166._4_4_;
      fVar168 = auVar166._8_4_;
      fVar169 = auVar166._12_4_;
      fVar170 = auVar166._16_4_;
      fVar171 = auVar166._20_4_;
      fVar172 = auVar166._24_4_;
      auVar37._4_4_ = fVar167 * fVar167 * fVar167 * auVar15._4_4_ * -0.5;
      auVar37._0_4_ = fVar133 * fVar133 * fVar133 * auVar15._0_4_ * -0.5;
      auVar37._8_4_ = fVar168 * fVar168 * fVar168 * auVar15._8_4_ * -0.5;
      auVar37._12_4_ = fVar169 * fVar169 * fVar169 * auVar15._12_4_ * -0.5;
      auVar37._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar37._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
      auVar37._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
      auVar37._28_4_ = 0;
      auVar206._8_4_ = 0x3fc00000;
      auVar206._0_8_ = 0x3fc000003fc00000;
      auVar206._12_4_ = 0x3fc00000;
      auVar206._16_4_ = 0x3fc00000;
      auVar206._20_4_ = 0x3fc00000;
      auVar206._24_4_ = 0x3fc00000;
      auVar206._28_4_ = 0x3fc00000;
      auVar15 = vfmadd231ps_fma(auVar37,auVar206,auVar166);
      fVar133 = auVar15._0_4_;
      fVar167 = auVar15._4_4_;
      auVar38._4_4_ = auVar129._4_4_ * fVar167;
      auVar38._0_4_ = auVar129._0_4_ * fVar133;
      fVar168 = auVar15._8_4_;
      auVar38._8_4_ = auVar129._8_4_ * fVar168;
      fVar169 = auVar15._12_4_;
      auVar38._12_4_ = auVar129._12_4_ * fVar169;
      auVar38._16_4_ = auVar129._16_4_ * 0.0;
      auVar38._20_4_ = auVar129._20_4_ * 0.0;
      auVar38._24_4_ = auVar129._24_4_ * 0.0;
      auVar38._28_4_ = auVar166._28_4_;
      auVar39._4_4_ = -auVar121._4_4_ * fVar167;
      auVar39._0_4_ = -auVar121._0_4_ * fVar133;
      auVar39._8_4_ = -auVar121._8_4_ * fVar168;
      auVar39._12_4_ = -auVar121._12_4_ * fVar169;
      auVar39._16_4_ = -auVar121._16_4_ * 0.0;
      auVar39._20_4_ = -auVar121._20_4_ * 0.0;
      auVar39._24_4_ = -auVar121._24_4_ * 0.0;
      auVar39._28_4_ = auVar121._28_4_ ^ 0x80000000;
      auVar15 = vfmadd213ps_fma(auVar112,auVar112,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar23,auVar23);
      auVar166 = vrsqrtps_avx(ZEXT1632(auVar15));
      auVar121 = ZEXT1632(CONCAT412(fVar169 * 0.0,
                                    CONCAT48(fVar168 * 0.0,CONCAT44(fVar167 * 0.0,fVar133 * 0.0))));
      fVar133 = auVar166._0_4_;
      fVar167 = auVar166._4_4_;
      fVar168 = auVar166._8_4_;
      fVar169 = auVar166._12_4_;
      fVar170 = auVar166._16_4_;
      fVar171 = auVar166._20_4_;
      fVar172 = auVar166._24_4_;
      auVar40._4_4_ = fVar167 * fVar167 * auVar15._4_4_ * -0.5 * fVar167;
      auVar40._0_4_ = fVar133 * fVar133 * auVar15._0_4_ * -0.5 * fVar133;
      auVar40._8_4_ = fVar168 * fVar168 * auVar15._8_4_ * -0.5 * fVar168;
      auVar40._12_4_ = fVar169 * fVar169 * auVar15._12_4_ * -0.5 * fVar169;
      auVar40._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar40._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
      auVar40._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
      auVar40._28_4_ = 0xbf000000;
      auVar15 = vfmadd231ps_fma(auVar40,auVar206,auVar166);
      fVar133 = auVar15._0_4_;
      fVar167 = auVar15._4_4_;
      auVar41._4_4_ = fVar167 * auVar23._4_4_;
      auVar41._0_4_ = fVar133 * auVar23._0_4_;
      fVar168 = auVar15._8_4_;
      auVar41._8_4_ = fVar168 * auVar23._8_4_;
      fVar169 = auVar15._12_4_;
      auVar41._12_4_ = fVar169 * auVar23._12_4_;
      auVar41._16_4_ = auVar23._16_4_ * 0.0;
      auVar41._20_4_ = auVar23._20_4_ * 0.0;
      auVar41._24_4_ = auVar23._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar42._4_4_ = fVar167 * -auVar112._4_4_;
      auVar42._0_4_ = fVar133 * -auVar112._0_4_;
      auVar42._8_4_ = fVar168 * -auVar112._8_4_;
      auVar42._12_4_ = fVar169 * -auVar112._12_4_;
      auVar42._16_4_ = -auVar112._16_4_ * 0.0;
      auVar42._20_4_ = -auVar112._20_4_ * 0.0;
      auVar42._24_4_ = -auVar112._24_4_ * 0.0;
      auVar42._28_4_ = 0;
      auVar43._28_4_ = auVar166._28_4_;
      auVar43._0_28_ =
           ZEXT1628(CONCAT412(fVar169 * 0.0,
                              CONCAT48(fVar168 * 0.0,CONCAT44(fVar167 * 0.0,fVar133 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar109),local_480);
      auVar112 = ZEXT1632(auVar109);
      auVar146 = vfmadd213ps_fma(auVar39,auVar112,auVar114);
      auVar173 = vfmadd213ps_fma(auVar121,auVar112,ZEXT1632(auVar179));
      auVar26 = vfnmadd213ps_fma(auVar38,auVar112,local_480);
      auVar174 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar156),local_440);
      auVar25 = vfnmadd213ps_fma(auVar39,auVar112,auVar114);
      auVar112 = ZEXT1632(auVar156);
      auVar180 = vfmadd213ps_fma(auVar42,auVar112,local_460);
      auVar162 = ZEXT1632(auVar109);
      auVar189 = vfnmadd231ps_fma(ZEXT1632(auVar179),auVar162,auVar121);
      auVar179 = vfmadd213ps_fma(auVar43,auVar112,ZEXT1632(auVar14));
      auVar124 = vfnmadd213ps_fma(auVar41,auVar112,local_440);
      auVar181 = vfnmadd213ps_fma(auVar42,auVar112,local_460);
      auVar195 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar156),auVar43);
      auVar112 = vsubps_avx(ZEXT1632(auVar180),ZEXT1632(auVar25));
      auVar23 = vsubps_avx(ZEXT1632(auVar179),ZEXT1632(auVar189));
      auVar141._0_4_ = auVar189._0_4_ * auVar112._0_4_;
      auVar141._4_4_ = auVar189._4_4_ * auVar112._4_4_;
      auVar141._8_4_ = auVar189._8_4_ * auVar112._8_4_;
      auVar141._12_4_ = auVar189._12_4_ * auVar112._12_4_;
      auVar141._16_4_ = auVar112._16_4_ * 0.0;
      auVar141._20_4_ = auVar112._20_4_ * 0.0;
      auVar141._24_4_ = auVar112._24_4_ * 0.0;
      auVar141._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar141,ZEXT1632(auVar25),auVar23);
      auVar44._4_4_ = auVar23._4_4_ * auVar26._4_4_;
      auVar44._0_4_ = auVar23._0_4_ * auVar26._0_4_;
      auVar44._8_4_ = auVar23._8_4_ * auVar26._8_4_;
      auVar44._12_4_ = auVar23._12_4_ * auVar26._12_4_;
      auVar44._16_4_ = auVar23._16_4_ * 0.0;
      auVar44._20_4_ = auVar23._20_4_ * 0.0;
      auVar44._24_4_ = auVar23._24_4_ * 0.0;
      auVar44._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(ZEXT1632(auVar174),ZEXT1632(auVar26));
      auVar14 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar189),auVar23);
      auVar45._4_4_ = auVar25._4_4_ * auVar23._4_4_;
      auVar45._0_4_ = auVar25._0_4_ * auVar23._0_4_;
      auVar45._8_4_ = auVar25._8_4_ * auVar23._8_4_;
      auVar45._12_4_ = auVar25._12_4_ * auVar23._12_4_;
      auVar45._16_4_ = auVar23._16_4_ * 0.0;
      auVar45._20_4_ = auVar23._20_4_ * 0.0;
      auVar45._24_4_ = auVar23._24_4_ * 0.0;
      auVar45._28_4_ = auVar23._28_4_;
      auVar160 = ZEXT1632(auVar26);
      auVar26 = vfmsub231ps_fma(auVar45,auVar160,auVar112);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
      auVar123 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
      auVar112 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar15),auVar123);
      auVar23 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar146),auVar123);
      auVar191 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar173),auVar123);
      auVar166 = vblendvps_avx(auVar160,ZEXT1632(auVar174),auVar123);
      auVar121 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar180),auVar123);
      auVar129 = vblendvps_avx(ZEXT1632(auVar189),ZEXT1632(auVar179),auVar123);
      auVar160 = vblendvps_avx(ZEXT1632(auVar174),auVar160,auVar123);
      auVar187 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar25),auVar123);
      auVar14 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar24 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar189),auVar123);
      auVar22 = vsubps_avx(auVar160,auVar112);
      auVar114 = vsubps_avx(auVar187,auVar23);
      auVar139 = vsubps_avx(auVar24,auVar191);
      auVar157 = vsubps_avx(auVar112,auVar166);
      auVar182 = vsubps_avx(auVar23,auVar121);
      auVar131 = vsubps_avx(auVar191,auVar129);
      auVar46._4_4_ = auVar139._4_4_ * auVar112._4_4_;
      auVar46._0_4_ = auVar139._0_4_ * auVar112._0_4_;
      auVar46._8_4_ = auVar139._8_4_ * auVar112._8_4_;
      auVar46._12_4_ = auVar139._12_4_ * auVar112._12_4_;
      auVar46._16_4_ = auVar139._16_4_ * auVar112._16_4_;
      auVar46._20_4_ = auVar139._20_4_ * auVar112._20_4_;
      auVar46._24_4_ = auVar139._24_4_ * auVar112._24_4_;
      auVar46._28_4_ = auVar24._28_4_;
      auVar179 = vfmsub231ps_fma(auVar46,auVar191,auVar22);
      auVar47._4_4_ = auVar23._4_4_ * auVar22._4_4_;
      auVar47._0_4_ = auVar23._0_4_ * auVar22._0_4_;
      auVar47._8_4_ = auVar23._8_4_ * auVar22._8_4_;
      auVar47._12_4_ = auVar23._12_4_ * auVar22._12_4_;
      auVar47._16_4_ = auVar23._16_4_ * auVar22._16_4_;
      auVar47._20_4_ = auVar23._20_4_ * auVar22._20_4_;
      auVar47._24_4_ = auVar23._24_4_ * auVar22._24_4_;
      auVar47._28_4_ = auVar160._28_4_;
      auVar15 = vfmsub231ps_fma(auVar47,auVar112,auVar114);
      auVar192 = ZEXT864(0) << 0x20;
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
      fVar133 = auVar191._0_4_;
      auVar118._0_4_ = auVar114._0_4_ * fVar133;
      fVar167 = auVar191._4_4_;
      auVar118._4_4_ = auVar114._4_4_ * fVar167;
      fVar168 = auVar191._8_4_;
      auVar118._8_4_ = auVar114._8_4_ * fVar168;
      fVar169 = auVar191._12_4_;
      auVar118._12_4_ = auVar114._12_4_ * fVar169;
      fVar170 = auVar191._16_4_;
      auVar118._16_4_ = auVar114._16_4_ * fVar170;
      fVar171 = auVar191._20_4_;
      auVar118._20_4_ = auVar114._20_4_ * fVar171;
      fVar172 = auVar191._24_4_;
      auVar118._24_4_ = auVar114._24_4_ * fVar172;
      auVar118._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar118,auVar23,auVar139);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar119._0_4_ = auVar131._0_4_ * auVar166._0_4_;
      auVar119._4_4_ = auVar131._4_4_ * auVar166._4_4_;
      auVar119._8_4_ = auVar131._8_4_ * auVar166._8_4_;
      auVar119._12_4_ = auVar131._12_4_ * auVar166._12_4_;
      auVar119._16_4_ = auVar131._16_4_ * auVar166._16_4_;
      auVar119._20_4_ = auVar131._20_4_ * auVar166._20_4_;
      auVar119._24_4_ = auVar131._24_4_ * auVar166._24_4_;
      auVar119._28_4_ = 0;
      auVar179 = vfmsub231ps_fma(auVar119,auVar157,auVar129);
      auVar48._4_4_ = auVar182._4_4_ * auVar129._4_4_;
      auVar48._0_4_ = auVar182._0_4_ * auVar129._0_4_;
      auVar48._8_4_ = auVar182._8_4_ * auVar129._8_4_;
      auVar48._12_4_ = auVar182._12_4_ * auVar129._12_4_;
      auVar48._16_4_ = auVar182._16_4_ * auVar129._16_4_;
      auVar48._20_4_ = auVar182._20_4_ * auVar129._20_4_;
      auVar48._24_4_ = auVar182._24_4_ * auVar129._24_4_;
      auVar48._28_4_ = auVar129._28_4_;
      auVar109 = vfmsub231ps_fma(auVar48,auVar121,auVar131);
      auVar49._4_4_ = auVar157._4_4_ * auVar121._4_4_;
      auVar49._0_4_ = auVar157._0_4_ * auVar121._0_4_;
      auVar49._8_4_ = auVar157._8_4_ * auVar121._8_4_;
      auVar49._12_4_ = auVar157._12_4_ * auVar121._12_4_;
      auVar49._16_4_ = auVar157._16_4_ * auVar121._16_4_;
      auVar49._20_4_ = auVar157._20_4_ * auVar121._20_4_;
      auVar49._24_4_ = auVar157._24_4_ * auVar121._24_4_;
      auVar49._28_4_ = auVar187._28_4_;
      auVar146 = vfmsub231ps_fma(auVar49,auVar182,auVar166);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
      auVar166 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar109));
      auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
      auVar179 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
      auVar14 = vpand_avx(auVar179,auVar14);
      auVar166 = vpmovsxwd_avx2(auVar14);
      if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0x7f,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar166 >> 0xbf,0) == '\0') &&
          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar166[0x1f]) {
LAB_01356606:
        auVar188 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar112 = vpcmpeqd_avx2(auVar191,auVar191);
        auVar193 = ZEXT3264(auVar112);
      }
      else {
        auVar50._4_4_ = auVar114._4_4_ * auVar131._4_4_;
        auVar50._0_4_ = auVar114._0_4_ * auVar131._0_4_;
        auVar50._8_4_ = auVar114._8_4_ * auVar131._8_4_;
        auVar50._12_4_ = auVar114._12_4_ * auVar131._12_4_;
        auVar50._16_4_ = auVar114._16_4_ * auVar131._16_4_;
        auVar50._20_4_ = auVar114._20_4_ * auVar131._20_4_;
        auVar50._24_4_ = auVar114._24_4_ * auVar131._24_4_;
        auVar50._28_4_ = auVar166._28_4_;
        auVar174 = vfmsub231ps_fma(auVar50,auVar182,auVar139);
        auVar127._0_4_ = auVar139._0_4_ * auVar157._0_4_;
        auVar127._4_4_ = auVar139._4_4_ * auVar157._4_4_;
        auVar127._8_4_ = auVar139._8_4_ * auVar157._8_4_;
        auVar127._12_4_ = auVar139._12_4_ * auVar157._12_4_;
        auVar127._16_4_ = auVar139._16_4_ * auVar157._16_4_;
        auVar127._20_4_ = auVar139._20_4_ * auVar157._20_4_;
        auVar127._24_4_ = auVar139._24_4_ * auVar157._24_4_;
        auVar127._28_4_ = 0;
        auVar173 = vfmsub231ps_fma(auVar127,auVar22,auVar131);
        auVar51._4_4_ = auVar182._4_4_ * auVar22._4_4_;
        auVar51._0_4_ = auVar182._0_4_ * auVar22._0_4_;
        auVar51._8_4_ = auVar182._8_4_ * auVar22._8_4_;
        auVar51._12_4_ = auVar182._12_4_ * auVar22._12_4_;
        auVar51._16_4_ = auVar182._16_4_ * auVar22._16_4_;
        auVar51._20_4_ = auVar182._20_4_ * auVar22._20_4_;
        auVar51._24_4_ = auVar182._24_4_ * auVar22._24_4_;
        auVar51._28_4_ = auVar121._28_4_;
        auVar180 = vfmsub231ps_fma(auVar51,auVar157,auVar114);
        auVar179 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar173),ZEXT1632(auVar180));
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar174),_DAT_01f7b000);
        auVar166 = vrcpps_avx(ZEXT1632(auVar146));
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = 0x3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar191._16_4_ = 0x3f800000;
        auVar191._20_4_ = 0x3f800000;
        auVar191._24_4_ = 0x3f800000;
        auVar191._28_4_ = 0x3f800000;
        auVar179 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar146),auVar191);
        auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar166,auVar166);
        auVar177._0_4_ = auVar180._0_4_ * fVar133;
        auVar177._4_4_ = auVar180._4_4_ * fVar167;
        auVar177._8_4_ = auVar180._8_4_ * fVar168;
        auVar177._12_4_ = auVar180._12_4_ * fVar169;
        auVar177._16_4_ = fVar170 * 0.0;
        auVar177._20_4_ = fVar171 * 0.0;
        auVar177._24_4_ = fVar172 * 0.0;
        auVar177._28_4_ = 0;
        auVar173 = vfmadd231ps_fma(auVar177,auVar23,ZEXT1632(auVar173));
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),ZEXT1632(auVar174),auVar112);
        fVar133 = auVar179._0_4_;
        fVar167 = auVar179._4_4_;
        fVar168 = auVar179._8_4_;
        fVar169 = auVar179._12_4_;
        auVar166 = ZEXT1632(CONCAT412(fVar169 * auVar173._12_4_,
                                      CONCAT48(fVar168 * auVar173._8_4_,
                                               CONCAT44(fVar167 * auVar173._4_4_,
                                                        fVar133 * auVar173._0_4_))));
        auVar120._4_4_ = uVar105;
        auVar120._0_4_ = uVar105;
        auVar120._8_4_ = uVar105;
        auVar120._12_4_ = uVar105;
        auVar120._16_4_ = uVar105;
        auVar120._20_4_ = uVar105;
        auVar120._24_4_ = uVar105;
        auVar120._28_4_ = uVar105;
        uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar128._4_4_ = uVar102;
        auVar128._0_4_ = uVar102;
        auVar128._8_4_ = uVar102;
        auVar128._12_4_ = uVar102;
        auVar128._16_4_ = uVar102;
        auVar128._20_4_ = uVar102;
        auVar128._24_4_ = uVar102;
        auVar128._28_4_ = uVar102;
        auVar112 = vcmpps_avx(auVar120,auVar166,2);
        auVar23 = vcmpps_avx(auVar166,auVar128,2);
        auVar112 = vandps_avx(auVar23,auVar112);
        auVar179 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
        auVar14 = vpand_avx(auVar14,auVar179);
        auVar112 = vpmovsxwd_avx2(auVar14);
        auVar192 = ZEXT864(0) << 0x20;
        if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0x7f,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0xbf,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar112[0x1f]) goto LAB_01356606;
        auVar112 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar146),4);
        auVar179 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
        auVar14 = vpand_avx(auVar14,auVar179);
        auVar23 = vpmovsxwd_avx2(auVar14);
        auVar188 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar112 = vpcmpeqd_avx2(auVar191,auVar191);
        auVar193 = ZEXT3264(auVar112);
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0x7f,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0xbf,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar23[0x1f] < '\0') {
          auVar121 = ZEXT1632(CONCAT412(fVar169 * auVar15._12_4_,
                                        CONCAT48(fVar168 * auVar15._8_4_,
                                                 CONCAT44(fVar167 * auVar15._4_4_,
                                                          fVar133 * auVar15._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar169 * auVar109._12_4_,
                                        CONCAT48(fVar168 * auVar109._8_4_,
                                                 CONCAT44(fVar167 * auVar109._4_4_,
                                                          fVar133 * auVar109._0_4_))));
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = 0x3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar154._16_4_ = 0x3f800000;
          auVar154._20_4_ = 0x3f800000;
          auVar154._24_4_ = 0x3f800000;
          auVar154._28_4_ = 0x3f800000;
          auVar112 = vsubps_avx(auVar154,auVar121);
          _local_3c0 = vblendvps_avx(auVar112,auVar121,auVar123);
          auVar112 = vsubps_avx(auVar154,auVar129);
          local_4e0 = vblendvps_avx(auVar112,auVar129,auVar123);
          auVar188 = ZEXT3264(auVar23);
          local_3e0 = auVar166;
        }
      }
      auVar201 = ZEXT3264(_local_6a0);
      auVar112 = auVar188._0_32_;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar188[0x1f]) goto LAB_013551d8;
      auVar23 = vsubps_avx(ZEXT1632(auVar156),auVar162);
      auVar14 = vfmadd213ps_fma(auVar23,_local_3c0,auVar162);
      fVar133 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
      auVar52._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar133;
      auVar52._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar133;
      auVar52._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar133;
      auVar52._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar133;
      auVar52._16_4_ = fVar133 * 0.0;
      auVar52._20_4_ = fVar133 * 0.0;
      auVar52._24_4_ = fVar133 * 0.0;
      auVar52._28_4_ = 0;
      auVar23 = vcmpps_avx(local_3e0,auVar52,6);
      auVar166 = auVar112 & auVar23;
      if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0x7f,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar166 >> 0xbf,0) == '\0') &&
          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar166[0x1f]) {
        uVar103 = 0;
      }
      else {
        auVar130._8_4_ = 0xbf800000;
        auVar130._0_8_ = 0xbf800000bf800000;
        auVar130._12_4_ = 0xbf800000;
        auVar130._16_4_ = 0xbf800000;
        auVar130._20_4_ = 0xbf800000;
        auVar130._24_4_ = 0xbf800000;
        auVar130._28_4_ = 0xbf800000;
        auVar142._8_4_ = 0x40000000;
        auVar142._0_8_ = 0x4000000040000000;
        auVar142._12_4_ = 0x40000000;
        auVar142._16_4_ = 0x40000000;
        auVar142._20_4_ = 0x40000000;
        auVar142._24_4_ = 0x40000000;
        auVar142._28_4_ = 0x40000000;
        auVar14 = vfmadd213ps_fma(local_4e0,auVar142,auVar130);
        local_380 = _local_3c0;
        local_360 = ZEXT1632(auVar14);
        local_340 = local_3e0;
        local_320 = 0;
        local_4e0 = local_360;
        if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar103 = 0;
        }
        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                (uVar103 = CONCAT71((int7)(uVar103 >> 8),1),
                pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar112 = vandps_avx(auVar23,auVar112);
          fVar133 = 1.0 / auVar116._0_4_;
          local_2a0[0] = fVar133 * ((float)local_3c0._0_4_ + 0.0);
          local_2a0[1] = fVar133 * ((float)local_3c0._4_4_ + 1.0);
          local_2a0[2] = fVar133 * (fStack_3b8 + 2.0);
          local_2a0[3] = fVar133 * (fStack_3b4 + 3.0);
          fStack_290 = fVar133 * (fStack_3b0 + 4.0);
          fStack_28c = fVar133 * (fStack_3ac + 5.0);
          fStack_288 = fVar133 * (fStack_3a8 + 6.0);
          fStack_284 = fStack_3a4 + 7.0;
          local_4e0._0_8_ = auVar14._0_8_;
          local_4e0._8_8_ = auVar14._8_8_;
          local_280 = local_4e0._0_8_;
          uStack_278 = local_4e0._8_8_;
          uStack_270 = 0;
          uStack_268 = 0;
          local_260 = local_3e0;
          uVar102 = vmovmskps_avx(auVar112);
          uVar98 = 0;
          uVar104 = CONCAT44((int)(uVar103 >> 0x20),uVar102);
          for (uVar103 = uVar104; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
            uVar98 = uVar98 + 1;
          }
          local_6e0._4_4_ = uVar97;
          local_6e0._0_4_ = uVar97;
          local_6e0._8_4_ = uVar97;
          local_6e0._12_4_ = uVar97;
          local_6e0._16_4_ = uVar97;
          local_6e0._20_4_ = uVar97;
          local_6e0._24_4_ = uVar97;
          local_6e0._28_4_ = uVar97;
          local_660._0_4_ = local_660._4_4_;
          local_660._8_4_ = local_660._4_4_;
          local_660._12_4_ = local_660._4_4_;
          local_660._16_4_ = local_660._4_4_;
          local_660._20_4_ = local_660._4_4_;
          local_660._24_4_ = local_660._4_4_;
          local_660._28_4_ = local_660._4_4_;
          _local_580 = auVar21;
          local_31c = iVar96;
          local_310 = uVar155;
          uStack_308 = uVar87;
          local_300 = uVar88;
          uStack_2f8 = uVar89;
          local_2f0 = uVar90;
          uStack_2e8 = uVar91;
          while (uVar104 != 0) {
            uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
            fVar133 = local_2a0[uVar98];
            auVar110._4_4_ = fVar133;
            auVar110._0_4_ = fVar133;
            auVar110._8_4_ = fVar133;
            auVar110._12_4_ = fVar133;
            local_1e0._16_4_ = fVar133;
            local_1e0._0_16_ = auVar110;
            local_1e0._20_4_ = fVar133;
            local_1e0._24_4_ = fVar133;
            local_1e0._28_4_ = fVar133;
            local_1c0 = *(undefined4 *)((long)&local_280 + uVar98 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar98 * 4);
            fVar167 = 1.0 - fVar133;
            auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,ZEXT416(0xc0a00000));
            auVar179 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * 3.0)),
                                       ZEXT416((uint)(fVar133 + fVar133)),auVar14);
            auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,ZEXT416(0x40000000));
            auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * -3.0)),
                                      ZEXT416((uint)(fVar167 + fVar167)),auVar14);
            auVar109 = vfnmadd231ss_fma(ZEXT416((uint)(fVar133 * (fVar167 + fVar167))),
                                        ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
            auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),auVar110,
                                      ZEXT416((uint)(fVar167 * -2.0)));
            fVar133 = auVar14._0_4_ * 0.5;
            fVar167 = auVar15._0_4_ * 0.5;
            auVar149._0_4_ = fVar167 * local_6b0;
            auVar149._4_4_ = fVar167 * fStack_6ac;
            auVar149._8_4_ = fVar167 * fStack_6a8;
            auVar149._12_4_ = fVar167 * fStack_6a4;
            auVar135._4_4_ = fVar133;
            auVar135._0_4_ = fVar133;
            auVar135._8_4_ = fVar133;
            auVar135._12_4_ = fVar133;
            auVar14 = vfmadd132ps_fma(auVar135,auVar149,auVar19);
            fVar133 = auVar179._0_4_ * 0.5;
            auVar150._4_4_ = fVar133;
            auVar150._0_4_ = fVar133;
            auVar150._8_4_ = fVar133;
            auVar150._12_4_ = fVar133;
            auVar14 = vfmadd132ps_fma(auVar150,auVar14,auVar20);
            local_710.context = context->user;
            fVar133 = auVar109._0_4_ * 0.5;
            auVar136._4_4_ = fVar133;
            auVar136._0_4_ = fVar133;
            auVar136._8_4_ = fVar133;
            auVar136._12_4_ = fVar133;
            auVar179 = vfmadd132ps_fma(auVar136,auVar14,auVar10);
            local_240 = auVar179._0_4_;
            uStack_23c = local_240;
            uStack_238 = local_240;
            uStack_234 = local_240;
            uStack_230 = local_240;
            uStack_22c = local_240;
            uStack_228 = local_240;
            uStack_224 = local_240;
            auVar14 = vmovshdup_avx(auVar179);
            local_220 = auVar14._0_8_;
            uStack_218 = local_220;
            uStack_210 = local_220;
            uStack_208 = local_220;
            auVar14 = vshufps_avx(auVar179,auVar179,0xaa);
            local_200 = auVar14._0_8_;
            uStack_1f8 = local_200;
            uStack_1f0 = local_200;
            uStack_1e8 = local_200;
            uStack_1bc = local_1c0;
            uStack_1b8 = local_1c0;
            uStack_1b4 = local_1c0;
            uStack_1b0 = local_1c0;
            uStack_1ac = local_1c0;
            uStack_1a8 = local_1c0;
            uStack_1a4 = local_1c0;
            local_1a0 = local_660._0_8_;
            uStack_198 = local_660._8_8_;
            uStack_190 = local_660._16_8_;
            uStack_188 = local_660._24_8_;
            local_180 = local_6e0._0_8_;
            uStack_178 = local_6e0._8_8_;
            uStack_170 = local_6e0._16_8_;
            uStack_168 = local_6e0._24_8_;
            local_160 = (local_710.context)->instID[0];
            uStack_15c = local_160;
            uStack_158 = local_160;
            uStack_154 = local_160;
            uStack_150 = local_160;
            uStack_14c = local_160;
            uStack_148 = local_160;
            uStack_144 = local_160;
            local_140 = (local_710.context)->instPrimID[0];
            uStack_13c = local_140;
            uStack_138 = local_140;
            uStack_134 = local_140;
            uStack_130 = local_140;
            uStack_12c = local_140;
            uStack_128 = local_140;
            uStack_124 = local_140;
            local_640 = local_420;
            local_710.valid = (int *)local_640;
            local_710.geometryUserPtr = pGVar17->userPtr;
            local_710.hit = (RTCHitN *)&local_240;
            local_710.N = 8;
            local_710.ray = (RTCRayN *)ray;
            if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar112 = ZEXT1632(auVar193._0_16_);
              (*pGVar17->occlusionFilterN)(&local_710);
              auVar201 = ZEXT3264(_local_6a0);
              auVar112 = vpcmpeqd_avx2(auVar112,auVar112);
              auVar193 = ZEXT3264(auVar112);
              auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar23 = vpcmpeqd_avx2(auVar192._0_32_,local_640);
            auVar112 = auVar193._0_32_ & ~auVar23;
            if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar112 >> 0x7f,0) == '\0') &&
                  (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0xbf,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar112[0x1f]) {
              auVar23 = auVar193._0_32_ ^ auVar23;
            }
            else {
              p_Var18 = context->args->filter;
              if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar112 = ZEXT1632(auVar193._0_16_);
                (*p_Var18)(&local_710);
                auVar201 = ZEXT3264(_local_6a0);
                auVar112 = vpcmpeqd_avx2(auVar112,auVar112);
                auVar193 = ZEXT3264(auVar112);
                auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar112 = vpcmpeqd_avx2(auVar192._0_32_,local_640);
              auVar23 = auVar193._0_32_ ^ auVar112;
              auVar143._8_4_ = 0xff800000;
              auVar143._0_8_ = 0xff800000ff800000;
              auVar143._12_4_ = 0xff800000;
              auVar143._16_4_ = 0xff800000;
              auVar143._20_4_ = 0xff800000;
              auVar143._24_4_ = 0xff800000;
              auVar143._28_4_ = 0xff800000;
              auVar112 = vblendvps_avx(auVar143,*(undefined1 (*) [32])(local_710.ray + 0x100),
                                       auVar112);
              *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar112;
            }
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              uVar103 = 1;
              goto LAB_01355813;
            }
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar102;
            uVar103 = uVar98 & 0x3f;
            uVar98 = 0;
            uVar104 = uVar104 ^ 1L << uVar103;
            for (uVar103 = uVar104; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000)
            {
              uVar98 = uVar98 + 1;
            }
          }
          uVar103 = 0;
        }
LAB_01355813:
      }
    }
    auVar196 = ZEXT3264(auVar196._0_32_);
    auVar192 = ZEXT3264(local_680);
    if (8 < iVar96) {
      local_480._4_4_ = iVar96;
      local_480._0_4_ = iVar96;
      local_480._8_4_ = iVar96;
      local_480._12_4_ = iVar96;
      local_480._16_4_ = iVar96;
      local_480._20_4_ = iVar96;
      local_480._24_4_ = iVar96;
      local_480._28_4_ = iVar96;
      local_4c0._4_4_ = uVar105;
      local_4c0._0_4_ = uVar105;
      local_4c0._8_4_ = uVar105;
      local_4c0._12_4_ = uVar105;
      local_4c0._16_4_ = uVar105;
      local_4c0._20_4_ = uVar105;
      local_4c0._24_4_ = uVar105;
      local_4c0._28_4_ = uVar105;
      local_120 = 1.0 / (float)local_540._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_540._4_4_ = uVar97;
      local_540._0_4_ = uVar97;
      uStack_538._0_4_ = uVar97;
      uStack_538._4_4_ = uVar97;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      _local_6a0 = auVar201._0_32_;
      uStack_530 = uVar97;
      uStack_52c = uVar97;
      uStack_528 = uVar97;
      uStack_524 = uVar97;
      local_4a0 = fVar134;
      fStack_49c = fVar134;
      fStack_498 = fVar134;
      fStack_494 = fVar134;
      fStack_490 = fVar134;
      fStack_48c = fVar134;
      fStack_488 = fVar134;
      fStack_484 = fVar134;
      for (lVar101 = 8; lVar101 < iVar96; lVar101 = lVar101 + 8) {
        auVar114 = auVar196._0_32_;
        auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 * 4 + lVar106);
        auVar23 = *(undefined1 (*) [32])(lVar106 + 0x22047f0 + lVar101 * 4);
        auVar166 = *(undefined1 (*) [32])(lVar106 + 0x2204c74 + lVar101 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar106 + 0x22050f8 + lVar101 * 4);
        auVar93 = *(undefined1 (*) [28])*pauVar5;
        auVar188._0_4_ = fVar197 * *(float *)*pauVar5;
        auVar188._4_4_ = fVar197 * *(float *)(*pauVar5 + 4);
        auVar188._8_4_ = fVar197 * *(float *)(*pauVar5 + 8);
        auVar188._12_4_ = fVar197 * *(float *)(*pauVar5 + 0xc);
        auVar188._16_4_ = fVar197 * *(float *)(*pauVar5 + 0x10);
        auVar188._20_4_ = fVar197 * *(float *)(*pauVar5 + 0x14);
        auVar188._28_36_ = auVar201._28_36_;
        auVar188._24_4_ = fVar197 * *(float *)(*pauVar5 + 0x18);
        auVar53._4_4_ = fVar216 * *(float *)(*pauVar5 + 4);
        auVar53._0_4_ = fVar213 * *(float *)*pauVar5;
        auVar53._8_4_ = fVar213 * *(float *)(*pauVar5 + 8);
        auVar53._12_4_ = fVar216 * *(float *)(*pauVar5 + 0xc);
        auVar53._16_4_ = fVar213 * *(float *)(*pauVar5 + 0x10);
        auVar53._20_4_ = fVar216 * *(float *)(*pauVar5 + 0x14);
        auVar53._24_4_ = fVar213 * *(float *)(*pauVar5 + 0x18);
        auVar53._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
        auVar19 = vfmadd231ps_fma(auVar188._0_32_,auVar166,auVar140);
        auVar20 = vfmadd231ps_fma(auVar53,auVar166,auVar158);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar23,auVar205);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar23,local_520);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar112,auVar153);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar112,local_5e0);
        auVar121 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 * 4 + lVar106);
        auVar129 = *(undefined1 (*) [32])(lVar106 + 0x2206c10 + lVar101 * 4);
        auVar160 = *(undefined1 (*) [32])(lVar106 + 0x2207094 + lVar101 * 4);
        pauVar6 = (undefined1 (*) [28])(lVar106 + 0x2207518 + lVar101 * 4);
        fVar172 = *(float *)*pauVar6;
        fVar198 = *(float *)(*pauVar6 + 4);
        fVar202 = *(float *)(*pauVar6 + 8);
        fVar208 = *(float *)(*pauVar6 + 0xc);
        fVar209 = *(float *)(*pauVar6 + 0x10);
        fVar210 = *(float *)(*pauVar6 + 0x14);
        fVar211 = *(float *)(*pauVar6 + 0x18);
        auVar94 = *pauVar6;
        auVar54._4_4_ = fVar198 * fVar197;
        auVar54._0_4_ = fVar172 * fVar197;
        auVar54._8_4_ = fVar202 * fVar197;
        auVar54._12_4_ = fVar208 * fVar197;
        auVar54._16_4_ = fVar209 * fVar197;
        auVar54._20_4_ = fVar210 * fVar197;
        auVar54._24_4_ = fVar211 * fVar197;
        auVar54._28_4_ = auVar166._28_4_;
        auVar55._4_4_ = fVar198 * fVar216;
        auVar55._0_4_ = fVar172 * fVar213;
        auVar55._8_4_ = fVar202 * fVar213;
        auVar55._12_4_ = fVar208 * fVar216;
        auVar55._16_4_ = fVar209 * fVar213;
        auVar55._20_4_ = fVar210 * fVar216;
        auVar55._24_4_ = fVar211 * fVar213;
        auVar55._28_4_ = fVar216;
        auVar10 = vfmadd231ps_fma(auVar54,auVar160,auVar140);
        auVar14 = vfmadd231ps_fma(auVar55,auVar160,auVar158);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar129,auVar205);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar129,local_520);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,auVar153);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_5e0);
        local_660 = ZEXT1632(auVar10);
        local_460 = ZEXT1632(auVar19);
        auVar24 = vsubps_avx(local_660,local_460);
        local_6e0 = ZEXT1632(auVar14);
        local_440 = ZEXT1632(auVar20);
        auVar123 = vsubps_avx(local_6e0,local_440);
        auVar56._4_4_ = auVar20._4_4_ * auVar24._4_4_;
        auVar56._0_4_ = auVar20._0_4_ * auVar24._0_4_;
        auVar56._8_4_ = auVar20._8_4_ * auVar24._8_4_;
        auVar56._12_4_ = auVar20._12_4_ * auVar24._12_4_;
        auVar56._16_4_ = auVar24._16_4_ * 0.0;
        auVar56._20_4_ = auVar24._20_4_ * 0.0;
        auVar56._24_4_ = auVar24._24_4_ * 0.0;
        auVar56._28_4_ = local_5e0._28_4_;
        fVar134 = auVar123._0_4_;
        fVar133 = auVar123._4_4_;
        auVar95._4_4_ = auVar19._4_4_ * fVar133;
        auVar95._0_4_ = auVar19._0_4_ * fVar134;
        fVar167 = auVar123._8_4_;
        auVar95._8_4_ = auVar19._8_4_ * fVar167;
        fVar168 = auVar123._12_4_;
        auVar95._12_4_ = auVar19._12_4_ * fVar168;
        fVar169 = auVar123._16_4_;
        auVar95._16_4_ = fVar169 * 0.0;
        fVar170 = auVar123._20_4_;
        auVar95._20_4_ = fVar170 * 0.0;
        fVar171 = auVar123._24_4_;
        auVar95._24_4_ = fVar171 * 0.0;
        auVar95._28_4_ = uVar194;
        auVar201 = ZEXT3264(*pauVar5);
        auVar21 = vsubps_avx(auVar56,auVar95);
        auVar161._0_4_ = auVar93._0_4_ * (float)local_100;
        auVar161._4_4_ = auVar93._4_4_ * local_100._4_4_;
        auVar161._8_4_ = auVar93._8_4_ * (float)uStack_f8;
        auVar161._12_4_ = auVar93._12_4_ * uStack_f8._4_4_;
        auVar161._16_4_ = auVar93._16_4_ * (float)uStack_f0;
        auVar161._20_4_ = auVar93._20_4_ * uStack_f0._4_4_;
        auVar161._24_4_ = auVar93._24_4_ * (float)uStack_e8;
        auVar161._28_4_ = 0;
        auVar19 = vfmadd231ps_fma(auVar161,local_e0,auVar166);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_c0,auVar23);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar112);
        auVar57._4_4_ = fVar198 * local_100._4_4_;
        auVar57._0_4_ = fVar172 * (float)local_100;
        auVar57._8_4_ = fVar202 * (float)uStack_f8;
        auVar57._12_4_ = fVar208 * uStack_f8._4_4_;
        auVar57._16_4_ = fVar209 * (float)uStack_f0;
        auVar57._20_4_ = fVar210 * uStack_f0._4_4_;
        auVar57._24_4_ = fVar211 * (float)uStack_e8;
        auVar57._28_4_ = uStack_e8._4_4_;
        auVar20 = vfmadd231ps_fma(auVar57,auVar160,local_e0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar129,local_c0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar121,local_a0);
        auVar86._4_4_ = fVar133 * fVar133;
        auVar86._0_4_ = fVar134 * fVar134;
        auVar86._8_4_ = fVar167 * fVar167;
        auVar86._12_4_ = fVar168 * fVar168;
        auVar86._16_4_ = fVar169 * fVar169;
        auVar86._20_4_ = fVar170 * fVar170;
        auVar86._24_4_ = fVar171 * fVar171;
        auVar86._28_4_ = local_520._28_4_;
        auVar10 = vfmadd231ps_fma(auVar86,auVar24,auVar24);
        auVar187 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
        auVar185._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar10._0_4_;
        auVar185._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar10._4_4_;
        auVar185._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar10._8_4_;
        auVar185._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar10._12_4_;
        auVar185._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
        auVar185._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
        auVar185._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
        auVar185._28_4_ = 0;
        auVar58._4_4_ = auVar21._4_4_ * auVar21._4_4_;
        auVar58._0_4_ = auVar21._0_4_ * auVar21._0_4_;
        auVar58._8_4_ = auVar21._8_4_ * auVar21._8_4_;
        auVar58._12_4_ = auVar21._12_4_ * auVar21._12_4_;
        auVar58._16_4_ = auVar21._16_4_ * auVar21._16_4_;
        auVar58._20_4_ = auVar21._20_4_ * auVar21._20_4_;
        auVar58._24_4_ = auVar21._24_4_ * auVar21._24_4_;
        auVar58._28_4_ = auVar21._28_4_;
        auVar187 = vcmpps_avx(auVar58,auVar185,2);
        local_320 = (int)lVar101;
        auVar186._4_4_ = local_320;
        auVar186._0_4_ = local_320;
        auVar186._8_4_ = local_320;
        auVar186._12_4_ = local_320;
        auVar186._16_4_ = local_320;
        auVar186._20_4_ = local_320;
        auVar186._24_4_ = local_320;
        auVar186._28_4_ = local_320;
        auVar21 = vpor_avx2(auVar186,_DAT_01fb4ba0);
        auVar22 = vpcmpgtd_avx2(local_480,auVar21);
        auVar21 = auVar22 & auVar187;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0x7f,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0xbf,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar21[0x1f]) {
          auVar196 = ZEXT3264(auVar114);
        }
        else {
          _local_580 = vandps_avx(auVar22,auVar187);
          local_740 = auVar94._0_4_;
          fStack_73c = auVar94._4_4_;
          fStack_738 = auVar94._8_4_;
          fStack_734 = auVar94._12_4_;
          fStack_730 = auVar94._16_4_;
          fStack_72c = auVar94._20_4_;
          fStack_728 = auVar94._24_4_;
          auVar59._4_4_ = (float)local_6a0._4_4_ * fStack_73c;
          auVar59._0_4_ = (float)local_6a0._0_4_ * local_740;
          auVar59._8_4_ = fStack_698 * fStack_738;
          auVar59._12_4_ = fStack_694 * fStack_734;
          auVar59._16_4_ = fStack_690 * fStack_730;
          auVar59._20_4_ = fStack_68c * fStack_72c;
          auVar59._24_4_ = fStack_688 * fStack_728;
          auVar59._28_4_ = auVar187._28_4_;
          auVar10 = vfmadd213ps_fma(auVar160,local_3a0,auVar59);
          auVar10 = vfmadd213ps_fma(auVar129,local_5a0,ZEXT1632(auVar10));
          auVar10 = vfmadd132ps_fma(auVar121,ZEXT1632(auVar10),local_5c0);
          auVar60._4_4_ = auVar93._4_4_ * (float)local_6a0._4_4_;
          auVar60._0_4_ = auVar93._0_4_ * (float)local_6a0._0_4_;
          auVar60._8_4_ = auVar93._8_4_ * fStack_698;
          auVar60._12_4_ = auVar93._12_4_ * fStack_694;
          auVar60._16_4_ = auVar93._16_4_ * fStack_690;
          auVar60._20_4_ = auVar93._20_4_ * fStack_68c;
          auVar60._24_4_ = auVar93._24_4_ * fStack_688;
          auVar60._28_4_ = auVar187._28_4_;
          auVar14 = vfmadd213ps_fma(auVar166,local_3a0,auVar60);
          auVar14 = vfmadd213ps_fma(auVar23,local_5a0,ZEXT1632(auVar14));
          auVar23 = *(undefined1 (*) [32])(lVar106 + 0x220557c + lVar101 * 4);
          auVar166 = *(undefined1 (*) [32])(lVar106 + 0x2205a00 + lVar101 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar106 + 0x2205e84 + lVar101 * 4);
          pfVar7 = (float *)(lVar106 + 0x2206308 + lVar101 * 4);
          fVar134 = *pfVar7;
          fVar133 = pfVar7[1];
          fVar167 = pfVar7[2];
          fVar168 = pfVar7[3];
          fVar169 = pfVar7[4];
          fVar170 = pfVar7[5];
          fVar171 = pfVar7[6];
          auVar61._4_4_ = fVar133 * fVar197;
          auVar61._0_4_ = fVar134 * fVar197;
          auVar61._8_4_ = fVar167 * fVar197;
          auVar61._12_4_ = fVar168 * fVar197;
          auVar61._16_4_ = fVar169 * fVar197;
          auVar61._20_4_ = fVar170 * fVar197;
          auVar61._24_4_ = fVar171 * fVar197;
          auVar61._28_4_ = auVar24._28_4_;
          auVar62._4_4_ = fVar133 * fVar216;
          auVar62._0_4_ = fVar134 * fVar213;
          auVar62._8_4_ = fVar167 * fVar213;
          auVar62._12_4_ = fVar168 * fVar216;
          auVar62._16_4_ = fVar169 * fVar213;
          auVar62._20_4_ = fVar170 * fVar216;
          auVar62._24_4_ = fVar171 * fVar213;
          auVar62._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
          auVar63._4_4_ = fVar133 * (float)local_6a0._4_4_;
          auVar63._0_4_ = fVar134 * (float)local_6a0._0_4_;
          auVar63._8_4_ = fVar167 * fStack_698;
          auVar63._12_4_ = fVar168 * fStack_694;
          auVar63._16_4_ = fVar169 * fStack_690;
          auVar63._20_4_ = fVar170 * fStack_68c;
          auVar63._24_4_ = fVar171 * fStack_688;
          auVar63._28_4_ = pfVar7[7];
          auVar179 = vfmadd231ps_fma(auVar61,auVar121,auVar140);
          auVar15 = vfmadd231ps_fma(auVar62,auVar121,auVar158);
          auVar109 = vfmadd231ps_fma(auVar63,local_3a0,auVar121);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar166,auVar205);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar166,local_520);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),local_5a0,auVar166);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar23,auVar153);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar23,local_5e0);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar23,local_5c0);
          pfVar7 = (float *)(lVar106 + 0x2208728 + lVar101 * 4);
          fVar134 = *pfVar7;
          fVar133 = pfVar7[1];
          fVar167 = pfVar7[2];
          fVar168 = pfVar7[3];
          fVar169 = pfVar7[4];
          fVar170 = pfVar7[5];
          fVar171 = pfVar7[6];
          auVar64._4_4_ = fVar197 * fVar133;
          auVar64._0_4_ = fVar197 * fVar134;
          auVar64._8_4_ = fVar197 * fVar167;
          auVar64._12_4_ = fVar197 * fVar168;
          auVar64._16_4_ = fVar197 * fVar169;
          auVar64._20_4_ = fVar197 * fVar170;
          auVar64._24_4_ = fVar197 * fVar171;
          auVar64._28_4_ = local_5a0._28_4_;
          auVar65._4_4_ = fVar216 * fVar133;
          auVar65._0_4_ = fVar213 * fVar134;
          auVar65._8_4_ = fVar213 * fVar167;
          auVar65._12_4_ = fVar216 * fVar168;
          auVar65._16_4_ = fVar213 * fVar169;
          auVar65._20_4_ = fVar216 * fVar170;
          auVar65._24_4_ = fVar213 * fVar171;
          auVar65._28_4_ = auVar123._28_4_;
          auVar66._4_4_ = fVar133 * (float)local_6a0._4_4_;
          auVar66._0_4_ = fVar134 * (float)local_6a0._0_4_;
          auVar66._8_4_ = fVar167 * fStack_698;
          auVar66._12_4_ = fVar168 * fStack_694;
          auVar66._16_4_ = fVar169 * fStack_690;
          auVar66._20_4_ = fVar170 * fStack_68c;
          auVar66._24_4_ = fVar171 * fStack_688;
          auVar66._28_4_ = pfVar7[7];
          auVar23 = *(undefined1 (*) [32])(lVar106 + 0x22082a4 + lVar101 * 4);
          auVar156 = vfmadd231ps_fma(auVar64,auVar23,auVar140);
          auVar146 = vfmadd231ps_fma(auVar65,auVar23,auVar158);
          auVar173 = vfmadd231ps_fma(auVar66,local_3a0,auVar23);
          auVar23 = *(undefined1 (*) [32])(lVar106 + 0x2207e20 + lVar101 * 4);
          auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar23,auVar205);
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar23,local_520);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar23,local_5a0);
          auVar23 = *(undefined1 (*) [32])(lVar106 + 0x220799c + lVar101 * 4);
          auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar23,auVar153);
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar23,local_5e0);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_5c0,auVar23);
          auVar23 = vandps_avx(ZEXT1632(auVar179),local_400);
          auVar166 = vandps_avx(ZEXT1632(auVar15),local_400);
          auVar166 = vmaxps_avx(auVar23,auVar166);
          auVar23 = vandps_avx(ZEXT1632(auVar109),local_400);
          auVar23 = vmaxps_avx(auVar166,auVar23);
          auVar92._4_4_ = fStack_49c;
          auVar92._0_4_ = local_4a0;
          auVar92._8_4_ = fStack_498;
          auVar92._12_4_ = fStack_494;
          auVar92._16_4_ = fStack_490;
          auVar92._20_4_ = fStack_48c;
          auVar92._24_4_ = fStack_488;
          auVar92._28_4_ = fStack_484;
          auVar23 = vcmpps_avx(auVar23,auVar92,1);
          auVar121 = vblendvps_avx(ZEXT1632(auVar179),auVar24,auVar23);
          auVar129 = vblendvps_avx(ZEXT1632(auVar15),auVar123,auVar23);
          auVar23 = vandps_avx(ZEXT1632(auVar156),local_400);
          auVar166 = vandps_avx(ZEXT1632(auVar146),local_400);
          auVar166 = vmaxps_avx(auVar23,auVar166);
          auVar23 = vandps_avx(local_400,ZEXT1632(auVar173));
          auVar23 = vmaxps_avx(auVar166,auVar23);
          auVar166 = vcmpps_avx(auVar23,auVar92,1);
          auVar23 = vblendvps_avx(ZEXT1632(auVar156),auVar24,auVar166);
          auVar166 = vblendvps_avx(ZEXT1632(auVar146),auVar123,auVar166);
          auVar14 = vfmadd213ps_fma(auVar112,local_5c0,ZEXT1632(auVar14));
          auVar179 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar129,auVar129);
          auVar112 = vrsqrtps_avx(ZEXT1632(auVar179));
          fVar134 = auVar112._0_4_;
          fVar133 = auVar112._4_4_;
          fVar167 = auVar112._8_4_;
          fVar168 = auVar112._12_4_;
          fVar169 = auVar112._16_4_;
          fVar170 = auVar112._20_4_;
          fVar171 = auVar112._24_4_;
          auVar67._4_4_ = fVar133 * fVar133 * fVar133 * auVar179._4_4_ * -0.5;
          auVar67._0_4_ = fVar134 * fVar134 * fVar134 * auVar179._0_4_ * -0.5;
          auVar67._8_4_ = fVar167 * fVar167 * fVar167 * auVar179._8_4_ * -0.5;
          auVar67._12_4_ = fVar168 * fVar168 * fVar168 * auVar179._12_4_ * -0.5;
          auVar67._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar67._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar67._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar67._28_4_ = 0;
          auVar207._8_4_ = 0x3fc00000;
          auVar207._0_8_ = 0x3fc000003fc00000;
          auVar207._12_4_ = 0x3fc00000;
          auVar207._16_4_ = 0x3fc00000;
          auVar207._20_4_ = 0x3fc00000;
          auVar207._24_4_ = 0x3fc00000;
          auVar207._28_4_ = 0x3fc00000;
          auVar179 = vfmadd231ps_fma(auVar67,auVar207,auVar112);
          fVar134 = auVar179._0_4_;
          fVar133 = auVar179._4_4_;
          auVar68._4_4_ = auVar129._4_4_ * fVar133;
          auVar68._0_4_ = auVar129._0_4_ * fVar134;
          fVar167 = auVar179._8_4_;
          auVar68._8_4_ = auVar129._8_4_ * fVar167;
          fVar168 = auVar179._12_4_;
          auVar68._12_4_ = auVar129._12_4_ * fVar168;
          auVar68._16_4_ = auVar129._16_4_ * 0.0;
          auVar68._20_4_ = auVar129._20_4_ * 0.0;
          auVar68._24_4_ = auVar129._24_4_ * 0.0;
          auVar68._28_4_ = auVar129._28_4_;
          auVar69._4_4_ = fVar133 * -auVar121._4_4_;
          auVar69._0_4_ = fVar134 * -auVar121._0_4_;
          auVar69._8_4_ = fVar167 * -auVar121._8_4_;
          auVar69._12_4_ = fVar168 * -auVar121._12_4_;
          auVar69._16_4_ = -auVar121._16_4_ * 0.0;
          auVar69._20_4_ = -auVar121._20_4_ * 0.0;
          auVar69._24_4_ = -auVar121._24_4_ * 0.0;
          auVar69._28_4_ = auVar112._28_4_;
          auVar179 = vfmadd213ps_fma(auVar23,auVar23,ZEXT832(0) << 0x20);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar166,auVar166);
          auVar112 = vrsqrtps_avx(ZEXT1632(auVar179));
          auVar70._28_4_ = uVar194;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar168 * 0.0,
                                  CONCAT48(fVar167 * 0.0,CONCAT44(fVar133 * 0.0,fVar134 * 0.0))));
          fVar134 = auVar112._0_4_;
          fVar133 = auVar112._4_4_;
          fVar167 = auVar112._8_4_;
          fVar168 = auVar112._12_4_;
          fVar169 = auVar112._16_4_;
          fVar170 = auVar112._20_4_;
          fVar171 = auVar112._24_4_;
          auVar71._4_4_ = fVar133 * fVar133 * fVar133 * auVar179._4_4_ * -0.5;
          auVar71._0_4_ = fVar134 * fVar134 * fVar134 * auVar179._0_4_ * -0.5;
          auVar71._8_4_ = fVar167 * fVar167 * fVar167 * auVar179._8_4_ * -0.5;
          auVar71._12_4_ = fVar168 * fVar168 * fVar168 * auVar179._12_4_ * -0.5;
          auVar71._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar71._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar71._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar71._28_4_ = 0;
          auVar179 = vfmadd231ps_fma(auVar71,auVar207,auVar112);
          fVar134 = auVar179._0_4_;
          fVar133 = auVar179._4_4_;
          auVar72._4_4_ = auVar166._4_4_ * fVar133;
          auVar72._0_4_ = auVar166._0_4_ * fVar134;
          fVar167 = auVar179._8_4_;
          auVar72._8_4_ = auVar166._8_4_ * fVar167;
          fVar168 = auVar179._12_4_;
          auVar72._12_4_ = auVar166._12_4_ * fVar168;
          auVar72._16_4_ = auVar166._16_4_ * 0.0;
          auVar72._20_4_ = auVar166._20_4_ * 0.0;
          auVar72._24_4_ = auVar166._24_4_ * 0.0;
          auVar72._28_4_ = 0;
          auVar73._4_4_ = fVar133 * -auVar23._4_4_;
          auVar73._0_4_ = fVar134 * -auVar23._0_4_;
          auVar73._8_4_ = fVar167 * -auVar23._8_4_;
          auVar73._12_4_ = fVar168 * -auVar23._12_4_;
          auVar73._16_4_ = -auVar23._16_4_ * 0.0;
          auVar73._20_4_ = -auVar23._20_4_ * 0.0;
          auVar73._24_4_ = -auVar23._24_4_ * 0.0;
          auVar73._28_4_ = auVar112._28_4_;
          auVar74._28_4_ = 0xbf000000;
          auVar74._0_28_ =
               ZEXT1628(CONCAT412(fVar168 * 0.0,
                                  CONCAT48(fVar167 * 0.0,CONCAT44(fVar133 * 0.0,fVar134 * 0.0))));
          auVar179 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar19),local_460);
          auVar112 = ZEXT1632(auVar19);
          auVar15 = vfmadd213ps_fma(auVar69,auVar112,local_440);
          auVar109 = vfmadd213ps_fma(auVar70,auVar112,ZEXT1632(auVar14));
          auVar146 = vfnmadd213ps_fma(auVar68,auVar112,local_460);
          auVar156 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar20),local_660);
          auVar173 = vfnmadd213ps_fma(auVar69,auVar112,local_440);
          auVar131 = ZEXT1632(auVar20);
          auVar20 = vfmadd213ps_fma(auVar73,auVar131,local_6e0);
          auVar162 = ZEXT1632(auVar19);
          auVar19 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar162,auVar70);
          auVar14 = vfmadd213ps_fma(auVar74,auVar131,ZEXT1632(auVar10));
          auVar174 = vfnmadd213ps_fma(auVar72,auVar131,local_660);
          auVar180 = vfnmadd213ps_fma(auVar73,auVar131,local_6e0);
          auVar26 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar131,auVar74);
          auVar112 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar173));
          auVar23 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar19));
          auVar75._4_4_ = auVar112._4_4_ * auVar19._4_4_;
          auVar75._0_4_ = auVar112._0_4_ * auVar19._0_4_;
          auVar75._8_4_ = auVar112._8_4_ * auVar19._8_4_;
          auVar75._12_4_ = auVar112._12_4_ * auVar19._12_4_;
          auVar75._16_4_ = auVar112._16_4_ * 0.0;
          auVar75._20_4_ = auVar112._20_4_ * 0.0;
          auVar75._24_4_ = auVar112._24_4_ * 0.0;
          auVar75._28_4_ = uVar194;
          auVar10 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar173),auVar23);
          auVar76._4_4_ = auVar146._4_4_ * auVar23._4_4_;
          auVar76._0_4_ = auVar146._0_4_ * auVar23._0_4_;
          auVar76._8_4_ = auVar146._8_4_ * auVar23._8_4_;
          auVar76._12_4_ = auVar146._12_4_ * auVar23._12_4_;
          auVar76._16_4_ = auVar23._16_4_ * 0.0;
          auVar76._20_4_ = auVar23._20_4_ * 0.0;
          auVar76._24_4_ = auVar23._24_4_ * 0.0;
          auVar76._28_4_ = auVar23._28_4_;
          auVar187 = ZEXT1632(auVar146);
          auVar23 = vsubps_avx(ZEXT1632(auVar156),auVar187);
          auVar123 = ZEXT1632(auVar19);
          auVar19 = vfmsub231ps_fma(auVar76,auVar123,auVar23);
          auVar77._4_4_ = auVar173._4_4_ * auVar23._4_4_;
          auVar77._0_4_ = auVar173._0_4_ * auVar23._0_4_;
          auVar77._8_4_ = auVar173._8_4_ * auVar23._8_4_;
          auVar77._12_4_ = auVar173._12_4_ * auVar23._12_4_;
          auVar77._16_4_ = auVar23._16_4_ * 0.0;
          auVar77._20_4_ = auVar23._20_4_ * 0.0;
          auVar77._24_4_ = auVar23._24_4_ * 0.0;
          auVar77._28_4_ = auVar23._28_4_;
          auVar146 = vfmsub231ps_fma(auVar77,auVar187,auVar112);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
          auVar21 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
          auVar112 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar179),auVar21);
          auVar23 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar15),auVar21);
          auVar166 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar109),auVar21);
          auVar121 = vblendvps_avx(auVar187,ZEXT1632(auVar156),auVar21);
          auVar129 = vblendvps_avx(ZEXT1632(auVar173),ZEXT1632(auVar20),auVar21);
          auVar160 = vblendvps_avx(auVar123,ZEXT1632(auVar14),auVar21);
          auVar187 = vblendvps_avx(ZEXT1632(auVar156),auVar187,auVar21);
          auVar24 = vblendvps_avx(ZEXT1632(auVar20),ZEXT1632(auVar173),auVar21);
          auVar19 = vpackssdw_avx(local_580._0_16_,local_580._16_16_);
          auVar123 = vblendvps_avx(ZEXT1632(auVar14),auVar123,auVar21);
          auVar187 = vsubps_avx(auVar187,auVar112);
          auVar24 = vsubps_avx(auVar24,auVar23);
          auVar22 = vsubps_avx(auVar123,auVar166);
          auVar139 = vsubps_avx(auVar112,auVar121);
          auVar157 = vsubps_avx(auVar23,auVar129);
          auVar182 = vsubps_avx(auVar166,auVar160);
          auVar163._0_4_ = auVar22._0_4_ * auVar112._0_4_;
          auVar163._4_4_ = auVar22._4_4_ * auVar112._4_4_;
          auVar163._8_4_ = auVar22._8_4_ * auVar112._8_4_;
          auVar163._12_4_ = auVar22._12_4_ * auVar112._12_4_;
          auVar163._16_4_ = auVar22._16_4_ * auVar112._16_4_;
          auVar163._20_4_ = auVar22._20_4_ * auVar112._20_4_;
          auVar163._24_4_ = auVar22._24_4_ * auVar112._24_4_;
          auVar163._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar163,auVar166,auVar187);
          auVar78._4_4_ = auVar187._4_4_ * auVar23._4_4_;
          auVar78._0_4_ = auVar187._0_4_ * auVar23._0_4_;
          auVar78._8_4_ = auVar187._8_4_ * auVar23._8_4_;
          auVar78._12_4_ = auVar187._12_4_ * auVar23._12_4_;
          auVar78._16_4_ = auVar187._16_4_ * auVar23._16_4_;
          auVar78._20_4_ = auVar187._20_4_ * auVar23._20_4_;
          auVar78._24_4_ = auVar187._24_4_ * auVar23._24_4_;
          auVar78._28_4_ = auVar123._28_4_;
          auVar10 = vfmsub231ps_fma(auVar78,auVar112,auVar24);
          auVar201 = ZEXT864(0) << 0x20;
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar164._0_4_ = auVar24._0_4_ * auVar166._0_4_;
          auVar164._4_4_ = auVar24._4_4_ * auVar166._4_4_;
          auVar164._8_4_ = auVar24._8_4_ * auVar166._8_4_;
          auVar164._12_4_ = auVar24._12_4_ * auVar166._12_4_;
          auVar164._16_4_ = auVar24._16_4_ * auVar166._16_4_;
          auVar164._20_4_ = auVar24._20_4_ * auVar166._20_4_;
          auVar164._24_4_ = auVar24._24_4_ * auVar166._24_4_;
          auVar164._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar164,auVar23,auVar22);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
          auVar165._0_4_ = auVar182._0_4_ * auVar121._0_4_;
          auVar165._4_4_ = auVar182._4_4_ * auVar121._4_4_;
          auVar165._8_4_ = auVar182._8_4_ * auVar121._8_4_;
          auVar165._12_4_ = auVar182._12_4_ * auVar121._12_4_;
          auVar165._16_4_ = auVar182._16_4_ * auVar121._16_4_;
          auVar165._20_4_ = auVar182._20_4_ * auVar121._20_4_;
          auVar165._24_4_ = auVar182._24_4_ * auVar121._24_4_;
          auVar165._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar165,auVar139,auVar160);
          auVar79._4_4_ = auVar157._4_4_ * auVar160._4_4_;
          auVar79._0_4_ = auVar157._0_4_ * auVar160._0_4_;
          auVar79._8_4_ = auVar157._8_4_ * auVar160._8_4_;
          auVar79._12_4_ = auVar157._12_4_ * auVar160._12_4_;
          auVar79._16_4_ = auVar157._16_4_ * auVar160._16_4_;
          auVar79._20_4_ = auVar157._20_4_ * auVar160._20_4_;
          auVar79._24_4_ = auVar157._24_4_ * auVar160._24_4_;
          auVar79._28_4_ = auVar160._28_4_;
          auVar14 = vfmsub231ps_fma(auVar79,auVar129,auVar182);
          auVar80._4_4_ = auVar139._4_4_ * auVar129._4_4_;
          auVar80._0_4_ = auVar139._0_4_ * auVar129._0_4_;
          auVar80._8_4_ = auVar139._8_4_ * auVar129._8_4_;
          auVar80._12_4_ = auVar139._12_4_ * auVar129._12_4_;
          auVar80._16_4_ = auVar139._16_4_ * auVar129._16_4_;
          auVar80._20_4_ = auVar139._20_4_ * auVar129._20_4_;
          auVar80._24_4_ = auVar139._24_4_ * auVar129._24_4_;
          auVar80._28_4_ = auVar129._28_4_;
          auVar179 = vfmsub231ps_fma(auVar80,auVar157,auVar121);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar121 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar14));
          auVar121 = vcmpps_avx(auVar121,ZEXT832(0) << 0x20,2);
          auVar20 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
          auVar19 = vpand_avx(auVar20,auVar19);
          auVar121 = vpmovsxwd_avx2(auVar19);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) {
LAB_0135655b:
            auVar148._8_8_ = uStack_5f8;
            auVar148._0_8_ = local_600;
            auVar148._16_8_ = uStack_5f0;
            auVar148._24_8_ = uStack_5e8;
            auVar112 = vpcmpeqd_avx2(auVar187,auVar187);
            auVar188 = ZEXT3264(auVar112);
            auVar192 = ZEXT3264(auVar192._0_32_);
            auVar196 = ZEXT3264(auVar114);
          }
          else {
            auVar81._4_4_ = auVar24._4_4_ * auVar182._4_4_;
            auVar81._0_4_ = auVar24._0_4_ * auVar182._0_4_;
            auVar81._8_4_ = auVar24._8_4_ * auVar182._8_4_;
            auVar81._12_4_ = auVar24._12_4_ * auVar182._12_4_;
            auVar81._16_4_ = auVar24._16_4_ * auVar182._16_4_;
            auVar81._20_4_ = auVar24._20_4_ * auVar182._20_4_;
            auVar81._24_4_ = auVar24._24_4_ * auVar182._24_4_;
            auVar81._28_4_ = auVar121._28_4_;
            auVar109 = vfmsub231ps_fma(auVar81,auVar157,auVar22);
            auVar178._0_4_ = auVar139._0_4_ * auVar22._0_4_;
            auVar178._4_4_ = auVar139._4_4_ * auVar22._4_4_;
            auVar178._8_4_ = auVar139._8_4_ * auVar22._8_4_;
            auVar178._12_4_ = auVar139._12_4_ * auVar22._12_4_;
            auVar178._16_4_ = auVar139._16_4_ * auVar22._16_4_;
            auVar178._20_4_ = auVar139._20_4_ * auVar22._20_4_;
            auVar178._24_4_ = auVar139._24_4_ * auVar22._24_4_;
            auVar178._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar178,auVar187,auVar182);
            auVar82._4_4_ = auVar187._4_4_ * auVar157._4_4_;
            auVar82._0_4_ = auVar187._0_4_ * auVar157._0_4_;
            auVar82._8_4_ = auVar187._8_4_ * auVar157._8_4_;
            auVar82._12_4_ = auVar187._12_4_ * auVar157._12_4_;
            auVar82._16_4_ = auVar187._16_4_ * auVar157._16_4_;
            auVar82._20_4_ = auVar187._20_4_ * auVar157._20_4_;
            auVar82._24_4_ = auVar187._24_4_ * auVar157._24_4_;
            auVar82._28_4_ = auVar157._28_4_;
            auVar156 = vfmsub231ps_fma(auVar82,auVar139,auVar24);
            auVar20 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar15),ZEXT1632(auVar156));
            auVar179 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar109),ZEXT832(0) << 0x20);
            auVar187 = ZEXT1632(auVar179);
            auVar121 = vrcpps_avx(ZEXT1632(auVar179));
            auVar200._8_4_ = 0x3f800000;
            auVar200._0_8_ = 0x3f8000003f800000;
            auVar200._12_4_ = 0x3f800000;
            auVar200._16_4_ = 0x3f800000;
            auVar200._20_4_ = 0x3f800000;
            auVar200._24_4_ = 0x3f800000;
            auVar200._28_4_ = 0x3f800000;
            auVar201 = ZEXT3264(auVar200);
            auVar20 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar179),auVar200);
            auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar121,auVar121);
            auVar83._4_4_ = auVar156._4_4_ * auVar166._4_4_;
            auVar83._0_4_ = auVar156._0_4_ * auVar166._0_4_;
            auVar83._8_4_ = auVar156._8_4_ * auVar166._8_4_;
            auVar83._12_4_ = auVar156._12_4_ * auVar166._12_4_;
            auVar83._16_4_ = auVar166._16_4_ * 0.0;
            auVar83._20_4_ = auVar166._20_4_ * 0.0;
            auVar83._24_4_ = auVar166._24_4_ * 0.0;
            auVar83._28_4_ = auVar166._28_4_;
            auVar15 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar15),auVar23);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar109),auVar112);
            fVar134 = auVar20._0_4_;
            fVar133 = auVar20._4_4_;
            fVar167 = auVar20._8_4_;
            fVar168 = auVar20._12_4_;
            auVar166 = ZEXT1632(CONCAT412(fVar168 * auVar15._12_4_,
                                          CONCAT48(fVar167 * auVar15._8_4_,
                                                   CONCAT44(fVar133 * auVar15._4_4_,
                                                            fVar134 * auVar15._0_4_))));
            uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar147._4_4_ = uVar105;
            auVar147._0_4_ = uVar105;
            auVar147._8_4_ = uVar105;
            auVar147._12_4_ = uVar105;
            auVar147._16_4_ = uVar105;
            auVar147._20_4_ = uVar105;
            auVar147._24_4_ = uVar105;
            auVar147._28_4_ = uVar105;
            auVar112 = vcmpps_avx(local_4c0,auVar166,2);
            auVar23 = vcmpps_avx(auVar166,auVar147,2);
            auVar112 = vandps_avx(auVar23,auVar112);
            auVar20 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            auVar19 = vpand_avx(auVar19,auVar20);
            auVar112 = vpmovsxwd_avx2(auVar19);
            if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar112 >> 0x7f,0) == '\0') &&
                  (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0xbf,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar112[0x1f]) goto LAB_0135655b;
            auVar112 = vcmpps_avx(ZEXT1632(auVar179),ZEXT832(0) << 0x20,4);
            auVar179 = auVar112._16_16_;
            auVar20 = vpackssdw_avx(auVar112._0_16_,auVar179);
            auVar19 = vpand_avx(auVar19,auVar20);
            auVar23 = vpmovsxwd_avx2(auVar19);
            auVar148._8_8_ = uStack_5f8;
            auVar148._0_8_ = local_600;
            auVar148._16_8_ = uStack_5f0;
            auVar148._24_8_ = uStack_5e8;
            auVar112 = vpcmpeqd_avx2(ZEXT1632(auVar179),ZEXT1632(auVar179));
            auVar188 = ZEXT3264(auVar112);
            auVar192 = ZEXT3264(auVar192._0_32_);
            auVar196 = ZEXT3264(auVar114);
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              auVar121 = ZEXT1632(CONCAT412(fVar168 * auVar10._12_4_,
                                            CONCAT48(fVar167 * auVar10._8_4_,
                                                     CONCAT44(fVar133 * auVar10._4_4_,
                                                              fVar134 * auVar10._0_4_))));
              auVar84._28_4_ = SUB84(uStack_5e8,4);
              auVar84._0_28_ =
                   ZEXT1628(CONCAT412(fVar168 * auVar14._12_4_,
                                      CONCAT48(fVar167 * auVar14._8_4_,
                                               CONCAT44(fVar133 * auVar14._4_4_,
                                                        fVar134 * auVar14._0_4_))));
              auVar184._8_4_ = 0x3f800000;
              auVar184._0_8_ = 0x3f8000003f800000;
              auVar184._12_4_ = 0x3f800000;
              auVar184._16_4_ = 0x3f800000;
              auVar184._20_4_ = 0x3f800000;
              auVar184._24_4_ = 0x3f800000;
              auVar184._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar184,auVar121);
              auVar112 = vblendvps_avx(auVar112,auVar121,auVar21);
              auVar192 = ZEXT3264(auVar112);
              auVar112 = vsubps_avx(auVar184,auVar84);
              local_500 = vblendvps_avx(auVar112,auVar84,auVar21);
              auVar196 = ZEXT3264(auVar166);
              auVar148 = auVar23;
            }
          }
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar148 >> 0x7f,0) != '\0') ||
                (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0xbf,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar148[0x1f] < '\0') {
            auVar112 = vsubps_avx(auVar131,auVar162);
            local_680 = auVar192._0_32_;
            auVar19 = vfmadd213ps_fma(auVar112,local_680,auVar162);
            fVar134 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar85._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar134;
            auVar85._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar134;
            auVar85._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar134;
            auVar85._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar134;
            auVar85._16_4_ = fVar134 * 0.0;
            auVar85._20_4_ = fVar134 * 0.0;
            auVar85._24_4_ = fVar134 * 0.0;
            auVar85._28_4_ = fVar134;
            auVar166 = auVar196._0_32_;
            auVar112 = vcmpps_avx(auVar166,auVar85,6);
            auVar23 = auVar148 & auVar112;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              auVar132._8_4_ = 0xbf800000;
              auVar132._0_8_ = 0xbf800000bf800000;
              auVar132._12_4_ = 0xbf800000;
              auVar132._16_4_ = 0xbf800000;
              auVar132._20_4_ = 0xbf800000;
              auVar132._24_4_ = 0xbf800000;
              auVar132._28_4_ = 0xbf800000;
              auVar144._8_4_ = 0x40000000;
              auVar144._0_8_ = 0x4000000040000000;
              auVar144._12_4_ = 0x40000000;
              auVar144._16_4_ = 0x40000000;
              auVar144._20_4_ = 0x40000000;
              auVar144._24_4_ = 0x40000000;
              auVar144._28_4_ = 0x40000000;
              auVar19 = vfmadd213ps_fma(local_500,auVar144,auVar132);
              local_360 = ZEXT1632(auVar19);
              pGVar17 = (context->scene->geometries).items[uVar97].ptr;
              local_500 = local_360;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar99 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar99 = context->args;
                if ((pRVar99->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar99 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar99 >> 8),1),
                   pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar112 = vandps_avx(auVar112,auVar148);
                  fVar134 = (float)local_320;
                  local_2a0[0] = (fVar134 + auVar192._0_4_ + 0.0) * local_120;
                  local_2a0[1] = (fVar134 + auVar192._4_4_ + 1.0) * fStack_11c;
                  local_2a0[2] = (fVar134 + auVar192._8_4_ + 2.0) * fStack_118;
                  local_2a0[3] = (fVar134 + auVar192._12_4_ + 3.0) * fStack_114;
                  fStack_290 = (fVar134 + auVar192._16_4_ + 4.0) * fStack_110;
                  fStack_28c = (fVar134 + auVar192._20_4_ + 5.0) * fStack_10c;
                  fStack_288 = (fVar134 + auVar192._24_4_ + 6.0) * fStack_108;
                  fStack_284 = fVar134 + auVar192._28_4_ + 7.0;
                  local_500._0_8_ = auVar19._0_8_;
                  local_500._8_8_ = auVar19._8_8_;
                  local_280 = local_500._0_8_;
                  uStack_278 = local_500._8_8_;
                  uStack_270 = 0;
                  uStack_268 = 0;
                  local_260 = auVar166;
                  uVar105 = vmovmskps_avx(auVar112);
                  uVar98 = 0;
                  uVar100 = CONCAT44((int)((ulong)pRVar99 >> 0x20),uVar105);
                  for (uVar104 = uVar100; local_380 = local_680, local_340 = auVar166,
                      local_31c = iVar96, local_310 = uVar155, uStack_308 = uVar87,
                      local_300 = uVar88, uStack_2f8 = uVar89, local_2f0 = uVar90,
                      uStack_2e8 = uVar91, (uVar104 & 1) == 0;
                      uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                    uVar98 = uVar98 + 1;
                  }
                  while (auVar112 = auVar188._0_32_, uVar100 != 0) {
                    uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar134 = local_2a0[uVar98];
                    auVar111._4_4_ = fVar134;
                    auVar111._0_4_ = fVar134;
                    auVar111._8_4_ = fVar134;
                    auVar111._12_4_ = fVar134;
                    local_1e0._16_4_ = fVar134;
                    local_1e0._0_16_ = auVar111;
                    local_1e0._20_4_ = fVar134;
                    local_1e0._24_4_ = fVar134;
                    local_1e0._28_4_ = fVar134;
                    local_1c0 = *(undefined4 *)((long)&local_280 + uVar98 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar98 * 4);
                    fVar133 = 1.0 - fVar134;
                    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                              ZEXT416(0xc0a00000));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134 * 3.0)),
                                              ZEXT416((uint)(fVar134 + fVar134)),auVar19);
                    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                              ZEXT416(0x40000000));
                    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * -3.0)),
                                              ZEXT416((uint)(fVar133 + fVar133)),auVar19);
                    auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar134 * (fVar133 + fVar133))),
                                               ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),auVar111,
                                              ZEXT416((uint)(fVar133 * -2.0)));
                    fVar134 = auVar19._0_4_ * 0.5;
                    fVar133 = auVar10._0_4_ * 0.5;
                    auVar151._0_4_ = fVar133 * local_6b0;
                    auVar151._4_4_ = fVar133 * fStack_6ac;
                    auVar151._8_4_ = fVar133 * fStack_6a8;
                    auVar151._12_4_ = fVar133 * fStack_6a4;
                    auVar137._4_4_ = fVar134;
                    auVar137._0_4_ = fVar134;
                    auVar137._8_4_ = fVar134;
                    auVar137._12_4_ = fVar134;
                    auVar19 = vfmadd132ps_fma(auVar137,auVar151,auVar11);
                    fVar134 = auVar20._0_4_ * 0.5;
                    auVar152._4_4_ = fVar134;
                    auVar152._0_4_ = fVar134;
                    auVar152._8_4_ = fVar134;
                    auVar152._12_4_ = fVar134;
                    auVar19 = vfmadd132ps_fma(auVar152,auVar19,auVar12);
                    local_710.context = context->user;
                    fVar134 = auVar14._0_4_ * 0.5;
                    auVar138._4_4_ = fVar134;
                    auVar138._0_4_ = fVar134;
                    auVar138._8_4_ = fVar134;
                    auVar138._12_4_ = fVar134;
                    auVar20 = vfmadd132ps_fma(auVar138,auVar19,auVar13);
                    local_240 = auVar20._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar19 = vmovshdup_avx(auVar20);
                    local_220 = auVar19._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar19 = vshufps_avx(auVar20,auVar20,0xaa);
                    local_200 = auVar19._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_560._0_8_;
                    uStack_198 = local_560._8_8_;
                    uStack_190 = CONCAT44(uStack_54c,uStack_550);
                    uStack_188 = CONCAT44(uStack_544,uStack_548);
                    local_180 = local_540;
                    uStack_178 = uStack_538;
                    uStack_170 = CONCAT44(uStack_52c,uStack_530);
                    uStack_168 = CONCAT44(uStack_524,uStack_528);
                    local_160 = (local_710.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_710.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_640 = local_420;
                    local_710.valid = (int *)local_640;
                    local_710.geometryUserPtr = pGVar17->userPtr;
                    local_710.hit = (RTCHitN *)&local_240;
                    local_710.N = 8;
                    local_710.ray = (RTCRayN *)ray;
                    if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar112 = ZEXT1632(auVar188._0_16_);
                      auVar201 = ZEXT1664(auVar201._0_16_);
                      (*pGVar17->occlusionFilterN)(&local_710);
                    }
                    auVar23 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar121 = vpcmpeqd_avx2(auVar112,auVar112);
                    auVar112 = auVar121 & ~auVar23;
                    if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar112 >> 0x7f,0) == '\0') &&
                          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar112 >> 0xbf,0) == '\0') &&
                        (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar112[0x1f]) {
                      auVar23 = auVar121 ^ auVar23;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar121 = ZEXT1632(auVar121._0_16_);
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        (*p_Var18)(&local_710);
                      }
                      auVar112 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
                      ;
                      auVar121 = vpcmpeqd_avx2(auVar121,auVar121);
                      auVar23 = auVar121 ^ auVar112;
                      auVar145._8_4_ = 0xff800000;
                      auVar145._0_8_ = 0xff800000ff800000;
                      auVar145._12_4_ = 0xff800000;
                      auVar145._16_4_ = 0xff800000;
                      auVar145._20_4_ = 0xff800000;
                      auVar145._24_4_ = 0xff800000;
                      auVar145._28_4_ = 0xff800000;
                      auVar112 = vblendvps_avx(auVar145,*(undefined1 (*) [32])
                                                         (local_710.ray + 0x100),auVar112);
                      *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar112;
                    }
                    auVar188 = ZEXT3264(auVar121);
                    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0x7f,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0xbf,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar23[0x1f] < '\0') {
                      pRVar99 = (RTCIntersectArguments *)0x1;
                      goto LAB_0135659e;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar105;
                    uVar104 = uVar98 & 0x3f;
                    uVar98 = 0;
                    uVar100 = uVar100 ^ 1L << uVar104;
                    for (uVar104 = uVar100; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                      uVar98 = uVar98 + 1;
                    }
                  }
                  pRVar99 = (RTCIntersectArguments *)0x0;
LAB_0135659e:
                  auVar192 = ZEXT3264(local_680);
                  auVar196 = ZEXT3264(auVar166);
                }
              }
              uVar103 = (ulong)(byte)((byte)uVar103 | (byte)pRVar99);
            }
          }
        }
      }
    }
    if ((uVar103 & 1) != 0) break;
    uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar122._4_4_ = uVar105;
    auVar122._0_4_ = uVar105;
    auVar122._8_4_ = uVar105;
    auVar122._12_4_ = uVar105;
    auVar122._16_4_ = uVar105;
    auVar122._20_4_ = uVar105;
    auVar122._24_4_ = uVar105;
    auVar122._28_4_ = uVar105;
    auVar112 = vcmpps_avx(local_80,auVar122,2);
    uVar97 = vmovmskps_avx(auVar112);
    local_608 = (ulong)((uint)uVar107 & uVar97);
  }
  return local_608 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }